

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  undefined4 *puVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  size_t k;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined4 uVar44;
  float fVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  uint uVar50;
  int iVar51;
  AABBNodeMB4D *node1;
  ulong uVar52;
  ulong uVar53;
  undefined4 uVar54;
  undefined1 *puVar55;
  ulong uVar56;
  undefined1 (*pauVar57) [32];
  float *vertices1;
  ulong uVar58;
  uint uVar59;
  ulong *puVar60;
  NodeRef root;
  bool bVar61;
  float fVar71;
  float fVar72;
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 in_ZMM1 [64];
  undefined1 auVar82 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [36];
  float fVar96;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  float fVar108;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  float fVar122;
  float fVar134;
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar131 [64];
  float fVar138;
  float fVar148;
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar146;
  float fVar147;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar145 [64];
  float fVar152;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  float fVar164;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar162;
  float fVar163;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar161 [64];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar168;
  float fVar177;
  undefined1 auVar172 [32];
  undefined1 auVar169 [16];
  undefined1 auVar173 [32];
  float fVar175;
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar174 [64];
  undefined1 auVar182 [32];
  float fVar181;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  undefined1 auVar183 [64];
  undefined1 auVar193 [32];
  float fVar190;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar191 [32];
  undefined1 auVar194 [64];
  uint uVar201;
  float fVar202;
  float fVar204;
  uint uVar205;
  float fVar206;
  uint uVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar203 [64];
  float fVar215;
  float fVar216;
  float fVar217;
  uint uVar218;
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 in_ZMM12 [64];
  float fVar223;
  undefined1 auVar224 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 in_ZMM13 [64];
  float fVar232;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar233 [64];
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar241 [64];
  undefined1 auVar248 [36];
  vuint<4> *v_1;
  Precalculations pre;
  vint<8> itime;
  Vec3<embree::vfloat_impl<8>_> p1;
  vbool<8> terminated;
  Vec3<embree::vfloat_impl<8>_> p0;
  TravRayK<8,_false> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2d09;
  ulong local_2d08;
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [56];
  RayK<8> *local_2ca8;
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [8];
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  RayK<8> *pRStack_2c48;
  undefined8 local_2c40;
  float fStack_2c38;
  float fStack_2c34;
  float fStack_2c30;
  float fStack_2c2c;
  float fStack_2c28;
  float local_2c20 [4];
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  undefined1 (*local_2bf0) [32];
  Intersectors *local_2be8;
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [8];
  float fStack_2bb8;
  float fStack_2bb4;
  float fStack_2bb0;
  float fStack_2bac;
  float fStack_2ba8;
  float fStack_2ba4;
  BVH *local_2ba0;
  ulong local_2b98;
  ulong local_2b90;
  ulong local_2b88;
  undefined1 local_2b80 [8];
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float fStack_2b64;
  undefined1 local_2b60 [32];
  undefined1 local_2b40 [32];
  undefined1 local_2b20 [32];
  undefined1 local_2b00 [8];
  float fStack_2af8;
  float fStack_2af4;
  float fStack_2af0;
  float fStack_2aec;
  float fStack_2ae8;
  float fStack_2ae4;
  undefined1 local_2ae0 [8];
  float fStack_2ad8;
  float fStack_2ad4;
  float fStack_2ad0;
  float fStack_2acc;
  float fStack_2ac8;
  float fStack_2ac4;
  undefined1 local_2ac0 [8];
  float fStack_2ab8;
  float fStack_2ab4;
  float fStack_2ab0;
  float fStack_2aac;
  float fStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined1 local_2a80 [8];
  float fStack_2a78;
  float fStack_2a74;
  float fStack_2a70;
  float fStack_2a6c;
  float fStack_2a68;
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  undefined1 local_2a00 [32];
  uint local_29e0;
  uint uStack_29dc;
  uint uStack_29d8;
  uint uStack_29d4;
  uint uStack_29d0;
  uint uStack_29cc;
  uint uStack_29c8;
  uint uStack_29c4;
  uint local_29c0;
  uint uStack_29bc;
  uint uStack_29b8;
  uint uStack_29b4;
  uint uStack_29b0;
  uint uStack_29ac;
  uint uStack_29a8;
  uint uStack_29a4;
  undefined1 local_29a0 [8];
  float fStack_2998;
  float fStack_2994;
  float fStack_2990;
  float fStack_298c;
  float fStack_2988;
  float fStack_2984;
  undefined1 local_2980 [8];
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2840;
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720;
  float fStack_271c;
  float fStack_2718;
  float fStack_2714;
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  undefined4 uStack_26c4;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar130 [32];
  undefined1 auVar144 [32];
  undefined1 auVar192 [32];
  undefined1 auVar225 [32];
  
  local_2ba0 = (BVH *)This->ptr;
  if ((local_2ba0->root).ptr != 8) {
    auVar66 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar89 = ZEXT816(0) << 0x40;
    auVar97 = vpcmpeqd_avx2(auVar66,(undefined1  [32])valid_i->field_0);
    auVar66 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar89),5);
    auVar74 = auVar97 & auVar66;
    if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar74 >> 0x7f,0) != '\0') ||
          (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar74 >> 0xbf,0) != '\0') ||
        (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar74[0x1f] < '\0')
    {
      local_2be8 = This;
      auVar66 = vandps_avx(auVar66,auVar97);
      auVar8 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
      local_2840._0_4_ = *(float *)ray;
      local_2840._4_4_ = *(float *)(ray + 4);
      local_2840._8_4_ = *(float *)(ray + 8);
      local_2840._12_4_ = *(float *)(ray + 0xc);
      local_2840._16_4_ = *(float *)(ray + 0x10);
      local_2840._20_4_ = *(float *)(ray + 0x14);
      local_2840._24_4_ = *(float *)(ray + 0x18);
      local_2840._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_2840._32_4_ = *(float *)(ray + 0x20);
      local_2840._36_4_ = *(float *)(ray + 0x24);
      local_2840._40_4_ = *(float *)(ray + 0x28);
      local_2840._44_4_ = *(float *)(ray + 0x2c);
      local_2840._48_4_ = *(float *)(ray + 0x30);
      local_2840._52_4_ = *(float *)(ray + 0x34);
      local_2840._56_4_ = *(float *)(ray + 0x38);
      local_2840._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_2840._64_4_ = *(float *)(ray + 0x40);
      local_2840._68_4_ = *(float *)(ray + 0x44);
      local_2840._72_4_ = *(float *)(ray + 0x48);
      local_2840._76_4_ = *(float *)(ray + 0x4c);
      local_2840._80_4_ = *(float *)(ray + 0x50);
      local_2840._84_4_ = *(float *)(ray + 0x54);
      local_2840._88_4_ = *(float *)(ray + 0x58);
      local_2840._92_4_ = *(undefined4 *)(ray + 0x5c);
      local_27e0 = *(undefined1 (*) [32])(ray + 0x80);
      local_27c0 = *(undefined1 (*) [32])(ray + 0xa0);
      local_27a0 = *(undefined1 (*) [32])(ray + 0xc0);
      local_2920._8_4_ = 0x7fffffff;
      local_2920._0_8_ = 0x7fffffff7fffffff;
      local_2920._12_4_ = 0x7fffffff;
      local_2920._16_4_ = 0x7fffffff;
      local_2920._20_4_ = 0x7fffffff;
      local_2920._24_4_ = 0x7fffffff;
      local_2920._28_4_ = 0x7fffffff;
      auVar203 = ZEXT3264(local_2920);
      auVar191._8_4_ = 0x219392ef;
      auVar191._0_8_ = 0x219392ef219392ef;
      auVar191._12_4_ = 0x219392ef;
      auVar191._16_4_ = 0x219392ef;
      auVar191._20_4_ = 0x219392ef;
      auVar191._24_4_ = 0x219392ef;
      auVar191._28_4_ = 0x219392ef;
      auVar66 = vandps_avx(local_2920,local_27e0);
      auVar66 = vcmpps_avx(auVar66,auVar191,1);
      auVar74 = vblendvps_avx(local_27e0,auVar191,auVar66);
      auVar66 = vandps_avx(local_2920,local_27c0);
      auVar66 = vcmpps_avx(auVar66,auVar191,1);
      auVar97 = vblendvps_avx(local_27c0,auVar191,auVar66);
      auVar66 = vandps_avx(local_27a0,local_2920);
      auVar66 = vcmpps_avx(auVar66,auVar191,1);
      auVar66 = vblendvps_avx(local_27a0,auVar191,auVar66);
      auVar98 = vrcpps_avx(auVar74);
      auVar192._8_4_ = 0x3f800000;
      auVar192._0_8_ = &DAT_3f8000003f800000;
      auVar192._12_4_ = 0x3f800000;
      auVar192._16_4_ = 0x3f800000;
      auVar192._20_4_ = 0x3f800000;
      auVar192._24_4_ = 0x3f800000;
      auVar192._28_4_ = 0x3f800000;
      auVar194 = ZEXT3264(auVar192);
      auVar11 = vfnmadd213ps_fma(auVar74,auVar98,auVar192);
      auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar98,auVar98);
      auVar174 = ZEXT1664(auVar11);
      auVar74 = vrcpps_avx(auVar97);
      auVar12 = vfnmadd213ps_fma(auVar97,auVar74,auVar192);
      auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar74,auVar74);
      auVar161 = ZEXT1664(auVar12);
      auVar74 = vrcpps_avx(auVar66);
      auVar183 = ZEXT3264(auVar74);
      auVar13 = vfnmadd213ps_fma(auVar66,auVar74,auVar192);
      auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar74,auVar74);
      auVar145 = ZEXT1664(auVar13);
      local_2780 = ZEXT1632(auVar11);
      local_2760 = ZEXT1632(auVar12);
      local_2740 = ZEXT1632(auVar13);
      local_2720 = auVar11._0_4_ * *(float *)ray;
      fStack_271c = auVar11._4_4_ * *(float *)(ray + 4);
      fStack_2718 = auVar11._8_4_ * *(float *)(ray + 8);
      fStack_2714 = auVar11._12_4_ * *(float *)(ray + 0xc);
      fStack_2710 = *(float *)(ray + 0x10) * 0.0;
      fStack_270c = *(float *)(ray + 0x14) * 0.0;
      fStack_2708 = *(float *)(ray + 0x18) * 0.0;
      uStack_2704 = *(undefined4 *)(ray + 0x1c);
      local_2700 = *(float *)(ray + 0x20) * auVar12._0_4_;
      fStack_26fc = *(float *)(ray + 0x24) * auVar12._4_4_;
      fStack_26f8 = *(float *)(ray + 0x28) * auVar12._8_4_;
      fStack_26f4 = *(float *)(ray + 0x2c) * auVar12._12_4_;
      fStack_26f0 = *(float *)(ray + 0x30) * 0.0;
      fStack_26ec = *(float *)(ray + 0x34) * 0.0;
      fStack_26e8 = *(float *)(ray + 0x38) * 0.0;
      uStack_26e4 = *(undefined4 *)(ray + 0x3c);
      local_26e0 = *(float *)(ray + 0x40) * auVar13._0_4_;
      fStack_26dc = *(float *)(ray + 0x44) * auVar13._4_4_;
      fStack_26d8 = *(float *)(ray + 0x48) * auVar13._8_4_;
      fStack_26d4 = *(float *)(ray + 0x4c) * auVar13._12_4_;
      fStack_26d0 = *(float *)(ray + 0x50) * 0.0;
      fStack_26cc = *(float *)(ray + 0x54) * 0.0;
      fStack_26c8 = *(float *)(ray + 0x58) * 0.0;
      uStack_26c4 = *(undefined4 *)(ray + 0x5c);
      auVar66 = vcmpps_avx(ZEXT1632(auVar11),ZEXT1632(auVar89),1);
      auVar74._8_4_ = 0x10;
      auVar74._0_8_ = 0x1000000010;
      auVar74._12_4_ = 0x10;
      auVar74._16_4_ = 0x10;
      auVar74._20_4_ = 0x10;
      auVar74._24_4_ = 0x10;
      auVar74._28_4_ = 0x10;
      local_26c0 = vandps_avx(auVar66,auVar74);
      auVar97._8_4_ = 0x20;
      auVar97._0_8_ = 0x2000000020;
      auVar97._12_4_ = 0x20;
      auVar97._16_4_ = 0x20;
      auVar97._20_4_ = 0x20;
      auVar97._24_4_ = 0x20;
      auVar97._28_4_ = 0x20;
      auVar109._8_4_ = 0x30;
      auVar109._0_8_ = 0x3000000030;
      auVar109._12_4_ = 0x30;
      auVar109._16_4_ = 0x30;
      auVar109._20_4_ = 0x30;
      auVar109._24_4_ = 0x30;
      auVar109._28_4_ = 0x30;
      auVar74 = ZEXT1632(auVar89);
      auVar66 = vcmpps_avx(ZEXT1632(auVar12),auVar74,5);
      local_26a0 = vblendvps_avx(auVar109,auVar97,auVar66);
      auVar98._8_4_ = 0x40;
      auVar98._0_8_ = 0x4000000040;
      auVar98._12_4_ = 0x40;
      auVar98._16_4_ = 0x40;
      auVar98._20_4_ = 0x40;
      auVar98._24_4_ = 0x40;
      auVar98._28_4_ = 0x40;
      auVar110._8_4_ = 0x50;
      auVar110._0_8_ = 0x5000000050;
      auVar110._12_4_ = 0x50;
      auVar110._16_4_ = 0x50;
      auVar110._20_4_ = 0x50;
      auVar110._24_4_ = 0x50;
      auVar110._28_4_ = 0x50;
      auVar66 = vcmpps_avx(ZEXT1632(auVar13),auVar74,5);
      auVar131 = ZEXT3264(auVar66);
      local_2680 = vblendvps_avx(auVar110,auVar98,auVar66);
      auVar66 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar74);
      auVar74 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar74);
      local_2880 = vpmovsxwd_avx2(auVar8);
      auVar115 = ZEXT3264(local_2880);
      local_1e80._8_4_ = 0x7f800000;
      local_1e80._0_8_ = 0x7f8000007f800000;
      local_1e80._12_4_ = 0x7f800000;
      local_1e80._16_4_ = 0x7f800000;
      local_1e80._20_4_ = 0x7f800000;
      local_1e80._24_4_ = 0x7f800000;
      local_1e80._28_4_ = 0x7f800000;
      auVar233 = ZEXT3264(local_1e80);
      local_2660 = vblendvps_avx(local_1e80,auVar66,local_2880);
      auVar66._8_4_ = 0xff800000;
      auVar66._0_8_ = 0xff800000ff800000;
      auVar66._12_4_ = 0xff800000;
      auVar66._16_4_ = 0xff800000;
      auVar66._20_4_ = 0xff800000;
      auVar66._24_4_ = 0xff800000;
      auVar66._28_4_ = 0xff800000;
      auVar104 = ZEXT3264(auVar66);
      local_2640 = vblendvps_avx(auVar66,auVar74,local_2880);
      auVar89 = vpcmpeqd_avx(local_2640._0_16_,local_2640._0_16_);
      local_2b60 = vpmovsxwd_avx2(auVar8 ^ auVar89);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar59 = 5;
      }
      else {
        uVar59 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      local_2ca8 = ray + 0x100;
      puVar60 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar57 = (undefined1 (*) [32])local_1e40;
      local_2608 = (local_2ba0->root).ptr;
      local_28a0._16_16_ = mm_lookupmask_ps._0_16_;
      local_28a0._0_16_ = mm_lookupmask_ps._0_16_;
      auVar82 = ZEXT3264(local_28a0);
      local_1e60 = local_2660;
      puVar55 = local_2ac0;
      local_28c0 = mm_lookupmask_pd._0_8_;
      uStack_28b8 = mm_lookupmask_pd._8_8_;
      uStack_28b0 = mm_lookupmask_pd._0_8_;
      uStack_28a8 = mm_lookupmask_pd._8_8_;
      local_2bf0 = (undefined1 (*) [32])&local_29e0;
LAB_005b947f:
      pauVar57 = pauVar57 + -1;
      root.ptr = puVar60[-1];
      puVar60 = puVar60 + -1;
      if (root.ptr == 0xfffffffffffffff8) goto LAB_005ba8d6;
      local_2ca0 = *pauVar57;
      auVar241 = ZEXT3264(local_2ca0);
      auVar66 = vcmpps_avx(local_2ca0,local_2640,1);
      if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar66 >> 0x7f,0) == '\0') &&
            (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar66 >> 0xbf,0) == '\0') &&
          (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar66[0x1f])
      {
LAB_005ba8e7:
        iVar51 = 2;
      }
      else {
        uVar54 = vmovmskps_avx(auVar66);
        puVar55 = (undefined1 *)CONCAT44((int)((ulong)puVar55 >> 0x20),uVar54);
        iVar51 = 0;
        if ((uint)POPCOUNT(uVar54) <= uVar59) {
          auVar66 = vpcmpeqd_avx2(auVar82._0_32_,auVar82._0_32_);
          while (auVar82 = ZEXT3264(auVar66), puVar55 != (undefined1 *)0x0) {
            local_2ce0._0_8_ = puVar55;
            k = 0;
            for (; ((ulong)puVar55 & 1) == 0;
                puVar55 = (undefined1 *)((ulong)puVar55 >> 1 | 0x8000000000000000)) {
              k = k + 1;
            }
            local_2d00._0_8_ = k;
            auVar66 = ZEXT1632(auVar66._0_16_);
            auVar104 = ZEXT1664(auVar104._0_16_);
            auVar115 = ZEXT1664(auVar115._0_16_);
            auVar131 = ZEXT1664(auVar131._0_16_);
            auVar145 = ZEXT1664(auVar145._0_16_);
            auVar161 = ZEXT1664(auVar161._0_16_);
            auVar174 = ZEXT1664(auVar174._0_16_);
            auVar183 = ZEXT1664(auVar183._0_16_);
            auVar194 = ZEXT1664(auVar194._0_16_);
            auVar203 = ZEXT1664(auVar203._0_16_);
            in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            bVar61 = occluded1(local_2be8,local_2ba0,root,k,&local_2d09,ray,
                               (TravRayK<8,_false> *)&local_2840.field_0,context);
            if (bVar61) {
              *(undefined4 *)(local_2b60 + local_2d00._0_8_ * 4) = 0xffffffff;
            }
            puVar55 = (undefined1 *)(local_2ce0._0_8_ - 1 & local_2ce0._0_8_);
            auVar233 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar66 = vpcmpeqd_avx2(auVar66,auVar66);
            auVar241 = ZEXT3264(local_2ca0);
          }
          auVar66 = auVar66 & ~local_2b60;
          iVar51 = 3;
          puVar55 = (undefined1 *)0x0;
          if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar66 >> 0x7f,0) != '\0') ||
                (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar66 >> 0xbf,0) != '\0') ||
              (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar66[0x1f] < '\0') {
            auVar82 = ZEXT3264(local_2640);
            auVar93._8_4_ = 0xff800000;
            auVar93._0_8_ = 0xff800000ff800000;
            auVar93._12_4_ = 0xff800000;
            auVar93._16_4_ = 0xff800000;
            auVar93._20_4_ = 0xff800000;
            auVar93._24_4_ = 0xff800000;
            auVar93._28_4_ = 0xff800000;
            local_2640 = vblendvps_avx(local_2640,auVar93,local_2b60);
            iVar51 = 2;
          }
        }
        if (uVar59 < (uint)POPCOUNT(uVar54)) {
          do {
            uVar201 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_005ba8d6;
              auVar66 = vcmpps_avx(local_2640,auVar241._0_32_,6);
              if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar66 >> 0x7f,0) == '\0') &&
                    (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar66 >> 0xbf,0) == '\0') &&
                  (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar66[0x1f]) goto LAB_005ba8e7;
              local_2b98 = (ulong)(uVar201 & 0xf) - 8;
              auVar66 = vpcmpeqd_avx2(auVar104._0_32_,auVar104._0_32_);
              auVar104 = ZEXT3264(auVar66);
              auVar70 = local_2b60;
              if (local_2b98 == 0) goto LAB_005ba898;
              auVar82 = ZEXT3264(local_2b60 ^ auVar66);
              uVar53 = 0;
              goto LAB_005b9777;
            }
            uVar52 = root.ptr & 0xfffffffffffffff0;
            auVar66 = vcmpps_avx(local_2640,auVar241._0_32_,6);
            auVar241 = ZEXT3264(auVar233._0_32_);
            uVar53 = 0;
            root.ptr = 8;
            do {
              uVar56 = *(ulong *)(uVar52 + uVar53 * 8);
              if (uVar56 != 8) {
                uVar54 = *(undefined4 *)(uVar52 + 0x80 + uVar53 * 4);
                auVar99._4_4_ = uVar54;
                auVar99._0_4_ = uVar54;
                auVar99._8_4_ = uVar54;
                auVar99._12_4_ = uVar54;
                auVar99._16_4_ = uVar54;
                auVar99._20_4_ = uVar54;
                auVar99._24_4_ = uVar54;
                auVar99._28_4_ = uVar54;
                uVar54 = *(undefined4 *)(uVar52 + 0x20 + uVar53 * 4);
                auVar90._4_4_ = uVar54;
                auVar90._0_4_ = uVar54;
                auVar90._8_4_ = uVar54;
                auVar90._12_4_ = uVar54;
                auVar90._16_4_ = uVar54;
                auVar90._20_4_ = uVar54;
                auVar90._24_4_ = uVar54;
                auVar90._28_4_ = uVar54;
                auVar74 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar54 = *(undefined4 *)(uVar52 + 0xa0 + uVar53 * 4);
                auVar111._4_4_ = uVar54;
                auVar111._0_4_ = uVar54;
                auVar111._8_4_ = uVar54;
                auVar111._12_4_ = uVar54;
                auVar111._16_4_ = uVar54;
                auVar111._20_4_ = uVar54;
                auVar111._24_4_ = uVar54;
                auVar111._28_4_ = uVar54;
                auVar89 = vfmadd231ps_fma(auVar90,auVar74,auVar99);
                uVar54 = *(undefined4 *)(uVar52 + 0x40 + uVar53 * 4);
                auVar100._4_4_ = uVar54;
                auVar100._0_4_ = uVar54;
                auVar100._8_4_ = uVar54;
                auVar100._12_4_ = uVar54;
                auVar100._16_4_ = uVar54;
                auVar100._20_4_ = uVar54;
                auVar100._24_4_ = uVar54;
                auVar100._28_4_ = uVar54;
                auVar8 = vfmadd231ps_fma(auVar100,auVar74,auVar111);
                uVar54 = *(undefined4 *)(uVar52 + 0xc0 + uVar53 * 4);
                auVar124._4_4_ = uVar54;
                auVar124._0_4_ = uVar54;
                auVar124._8_4_ = uVar54;
                auVar124._12_4_ = uVar54;
                auVar124._16_4_ = uVar54;
                auVar124._20_4_ = uVar54;
                auVar124._24_4_ = uVar54;
                auVar124._28_4_ = uVar54;
                uVar54 = *(undefined4 *)(uVar52 + 0x60 + uVar53 * 4);
                auVar112._4_4_ = uVar54;
                auVar112._0_4_ = uVar54;
                auVar112._8_4_ = uVar54;
                auVar112._12_4_ = uVar54;
                auVar112._16_4_ = uVar54;
                auVar112._20_4_ = uVar54;
                auVar112._24_4_ = uVar54;
                auVar112._28_4_ = uVar54;
                uVar54 = *(undefined4 *)(uVar52 + 0x90 + uVar53 * 4);
                auVar155._4_4_ = uVar54;
                auVar155._0_4_ = uVar54;
                auVar155._8_4_ = uVar54;
                auVar155._12_4_ = uVar54;
                auVar155._16_4_ = uVar54;
                auVar155._20_4_ = uVar54;
                auVar155._24_4_ = uVar54;
                auVar155._28_4_ = uVar54;
                uVar54 = *(undefined4 *)(uVar52 + 0x30 + uVar53 * 4);
                auVar140._4_4_ = uVar54;
                auVar140._0_4_ = uVar54;
                auVar140._8_4_ = uVar54;
                auVar140._12_4_ = uVar54;
                auVar140._16_4_ = uVar54;
                auVar140._20_4_ = uVar54;
                auVar140._24_4_ = uVar54;
                auVar140._28_4_ = uVar54;
                auVar11 = vfmadd231ps_fma(auVar112,auVar74,auVar124);
                auVar12 = vfmadd231ps_fma(auVar140,auVar74,auVar155);
                uVar54 = *(undefined4 *)(uVar52 + 0xb0 + uVar53 * 4);
                auVar125._4_4_ = uVar54;
                auVar125._0_4_ = uVar54;
                auVar125._8_4_ = uVar54;
                auVar125._12_4_ = uVar54;
                auVar125._16_4_ = uVar54;
                auVar125._20_4_ = uVar54;
                auVar125._24_4_ = uVar54;
                auVar125._28_4_ = uVar54;
                uVar54 = *(undefined4 *)(uVar52 + 0x50 + uVar53 * 4);
                auVar156._4_4_ = uVar54;
                auVar156._0_4_ = uVar54;
                auVar156._8_4_ = uVar54;
                auVar156._12_4_ = uVar54;
                auVar156._16_4_ = uVar54;
                auVar156._20_4_ = uVar54;
                auVar156._24_4_ = uVar54;
                auVar156._28_4_ = uVar54;
                uVar54 = *(undefined4 *)(uVar52 + 0xd0 + uVar53 * 4);
                auVar170._4_4_ = uVar54;
                auVar170._0_4_ = uVar54;
                auVar170._8_4_ = uVar54;
                auVar170._12_4_ = uVar54;
                auVar170._16_4_ = uVar54;
                auVar170._20_4_ = uVar54;
                auVar170._24_4_ = uVar54;
                auVar170._28_4_ = uVar54;
                auVar13 = vfmadd231ps_fma(auVar156,auVar74,auVar125);
                uVar54 = *(undefined4 *)(uVar52 + 0x70 + uVar53 * 4);
                auVar182._4_4_ = uVar54;
                auVar182._0_4_ = uVar54;
                auVar182._8_4_ = uVar54;
                auVar182._12_4_ = uVar54;
                auVar182._16_4_ = uVar54;
                auVar182._20_4_ = uVar54;
                auVar182._24_4_ = uVar54;
                auVar182._28_4_ = uVar54;
                auVar153 = vfmadd231ps_fma(auVar182,auVar74,auVar170);
                auVar194 = ZEXT3264(local_2740);
                auVar47._4_4_ = fStack_271c;
                auVar47._0_4_ = local_2720;
                auVar47._8_4_ = fStack_2718;
                auVar47._12_4_ = fStack_2714;
                auVar47._16_4_ = fStack_2710;
                auVar47._20_4_ = fStack_270c;
                auVar47._24_4_ = fStack_2708;
                auVar47._28_4_ = uStack_2704;
                auVar203 = ZEXT3264(auVar47);
                auVar89 = vfmsub213ps_fma(ZEXT1632(auVar89),local_2780,auVar47);
                auVar48._4_4_ = fStack_26fc;
                auVar48._0_4_ = local_2700;
                auVar48._8_4_ = fStack_26f8;
                auVar48._12_4_ = fStack_26f4;
                auVar48._16_4_ = fStack_26f0;
                auVar48._20_4_ = fStack_26ec;
                auVar48._24_4_ = fStack_26e8;
                auVar48._28_4_ = uStack_26e4;
                in_ZMM12 = ZEXT3264(auVar48);
                auVar8 = vfmsub213ps_fma(ZEXT1632(auVar8),local_2760,auVar48);
                auVar49._4_4_ = fStack_26dc;
                auVar49._0_4_ = local_26e0;
                auVar49._8_4_ = fStack_26d8;
                auVar49._12_4_ = fStack_26d4;
                auVar49._16_4_ = fStack_26d0;
                auVar49._20_4_ = fStack_26cc;
                auVar49._24_4_ = fStack_26c8;
                auVar49._28_4_ = uStack_26c4;
                in_ZMM13 = ZEXT3264(auVar49);
                auVar11 = vfmsub213ps_fma(ZEXT1632(auVar11),local_2740,auVar49);
                auVar115 = ZEXT1664(auVar11);
                auVar12 = vfmsub213ps_fma(ZEXT1632(auVar12),local_2780,auVar47);
                auVar145 = ZEXT1664(auVar12);
                auVar13 = vfmsub213ps_fma(ZEXT1632(auVar13),local_2760,auVar48);
                auVar161 = ZEXT1664(auVar13);
                auVar153 = vfmsub213ps_fma(ZEXT1632(auVar153),local_2740,auVar49);
                auVar183 = ZEXT1664(auVar153);
                auVar97 = vpminsd_avx2(ZEXT1632(auVar89),ZEXT1632(auVar12));
                auVar98 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar13));
                auVar97 = vpmaxsd_avx2(auVar97,auVar98);
                auVar98 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar153));
                auVar174 = ZEXT3264(auVar98);
                auVar109 = vpmaxsd_avx2(auVar97,auVar98);
                auVar131 = ZEXT3264(auVar109);
                auVar97 = vpmaxsd_avx2(ZEXT1632(auVar89),ZEXT1632(auVar12));
                auVar98 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar13));
                auVar98 = vpminsd_avx2(auVar97,auVar98);
                auVar97 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar153));
                auVar97 = vpminsd_avx2(auVar98,auVar97);
                auVar98 = vpmaxsd_avx2(auVar109,local_2660);
                auVar97 = vpminsd_avx2(auVar97,local_2640);
                auVar97 = vcmpps_avx(auVar98,auVar97,2);
                if ((uVar201 & 7) == 6) {
                  uVar54 = *(undefined4 *)(uVar52 + 0xe0 + uVar53 * 4);
                  auVar101._4_4_ = uVar54;
                  auVar101._0_4_ = uVar54;
                  auVar101._8_4_ = uVar54;
                  auVar101._12_4_ = uVar54;
                  auVar101._16_4_ = uVar54;
                  auVar101._20_4_ = uVar54;
                  auVar101._24_4_ = uVar54;
                  auVar101._28_4_ = uVar54;
                  auVar98 = vcmpps_avx(auVar101,auVar74,2);
                  uVar54 = *(undefined4 *)(uVar52 + 0xf0 + uVar53 * 4);
                  auVar113._4_4_ = uVar54;
                  auVar113._0_4_ = uVar54;
                  auVar113._8_4_ = uVar54;
                  auVar113._12_4_ = uVar54;
                  auVar113._16_4_ = uVar54;
                  auVar113._20_4_ = uVar54;
                  auVar113._24_4_ = uVar54;
                  auVar113._28_4_ = uVar54;
                  auVar115 = ZEXT3264(auVar113);
                  auVar74 = vcmpps_avx(auVar74,auVar113,1);
                  auVar74 = vandps_avx(auVar98,auVar74);
                  auVar74 = vandps_avx(auVar74,auVar97);
                  auVar89 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
                }
                else {
                  auVar89 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
                }
                auVar104 = ZEXT3264(auVar98);
                auVar8 = vpackssdw_avx(auVar66._0_16_,auVar66._16_16_);
                auVar89 = vpand_avx(auVar89,auVar8);
                auVar74 = vpmovzxwd_avx2(auVar89);
                auVar74 = vpslld_avx2(auVar74,0x1f);
                auVar82 = ZEXT3264(auVar74);
                if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar74 >> 0x7f,0) != '\0') ||
                      (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0xbf,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar74[0x1f] < '\0') {
                  auVar74 = vblendvps_avx(auVar233._0_32_,auVar109,auVar74);
                  auVar82 = ZEXT3264(auVar74);
                  if (root.ptr != 8) {
                    *puVar60 = root.ptr;
                    puVar60 = puVar60 + 1;
                    *pauVar57 = auVar241._0_32_;
                    pauVar57 = pauVar57 + 1;
                  }
                  auVar241 = ZEXT3264(auVar74);
                  root.ptr = uVar56;
                }
              }
            } while ((uVar56 != 8) && (bVar61 = uVar53 < 3, uVar53 = uVar53 + 1, bVar61));
            iVar51 = 0;
            if (root.ptr == 8) {
LAB_005b971d:
              puVar55 = (undefined1 *)0x0;
              iVar51 = 4;
            }
            else {
              auVar66 = vcmpps_avx(local_2640,auVar241._0_32_,6);
              uVar54 = vmovmskps_avx(auVar66);
              puVar55 = (undefined1 *)0x1;
              if ((uint)POPCOUNT(uVar54) <= uVar59) {
                *puVar60 = root.ptr;
                puVar60 = puVar60 + 1;
                *pauVar57 = auVar241._0_32_;
                pauVar57 = pauVar57 + 1;
                goto LAB_005b971d;
              }
            }
          } while ((char)puVar55 != '\0');
        }
      }
      goto LAB_005ba8d9;
    }
  }
  return;
  while( true ) {
    uVar53 = local_2b90 + 1;
    auVar82 = ZEXT3264(auVar74);
    if (local_2b98 <= uVar53) break;
LAB_005b9777:
    local_2b90 = uVar53;
    puVar55 = (undefined1 *)(uVar53 * 0x60 + (root.ptr & 0xfffffffffffffff0));
    local_2900 = auVar82._0_32_;
    uVar50 = vmovmskps_avx(local_2900);
    uVar53 = CONCAT44((int)(uVar53 >> 0x20),uVar50);
    uVar201 = 0;
    for (; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x80000000) {
      uVar201 = uVar201 + 1;
    }
    local_2b88 = (ulong)uVar201;
    local_2d08 = 0;
    for (uVar52 = uVar53; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
      local_2d08 = local_2d08 + 1;
    }
    auVar82 = ZEXT3264(local_2900);
    uVar52 = 0;
    while( true ) {
      fVar211 = auVar145._28_4_;
      fVar209 = auVar131._28_4_;
      auVar248 = auVar241._28_36_;
      auVar66 = auVar82._0_32_;
      iVar51 = *(int *)(puVar55 + uVar52 * 4 + 0x50);
      if (iVar51 == -1) break;
      uVar201 = *(uint *)(puVar55 + uVar52 * 4 + 0x40);
      pGVar3 = (context->scene->geometries).items[uVar201].ptr;
      fVar213 = (pGVar3->time_range).lower;
      auVar62._4_4_ = fVar213;
      auVar62._0_4_ = fVar213;
      auVar62._8_4_ = fVar213;
      auVar62._12_4_ = fVar213;
      auVar62._16_4_ = fVar213;
      auVar62._20_4_ = fVar213;
      auVar62._24_4_ = fVar213;
      auVar62._28_4_ = fVar213;
      auVar74 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar62);
      fVar213 = (pGVar3->time_range).upper - fVar213;
      auVar63._4_4_ = fVar213;
      auVar63._0_4_ = fVar213;
      auVar63._8_4_ = fVar213;
      auVar63._12_4_ = fVar213;
      auVar63._16_4_ = fVar213;
      auVar63._20_4_ = fVar213;
      auVar63._24_4_ = fVar213;
      auVar63._28_4_ = fVar213;
      auVar74 = vdivps_avx(auVar74,auVar63);
      fVar213 = pGVar3->fnumTimeSegments;
      auVar9._4_4_ = fVar213 * auVar74._4_4_;
      auVar9._0_4_ = fVar213 * auVar74._0_4_;
      auVar9._8_4_ = fVar213 * auVar74._8_4_;
      auVar9._12_4_ = fVar213 * auVar74._12_4_;
      auVar9._16_4_ = fVar213 * auVar74._16_4_;
      auVar9._20_4_ = fVar213 * auVar74._20_4_;
      auVar9._24_4_ = fVar213 * auVar74._24_4_;
      auVar9._28_4_ = auVar74._28_4_;
      auVar74 = vroundps_avx(auVar9,1);
      fVar213 = fVar213 + -1.0;
      auVar77._4_4_ = fVar213;
      auVar77._0_4_ = fVar213;
      auVar77._8_4_ = fVar213;
      auVar77._12_4_ = fVar213;
      auVar77._16_4_ = fVar213;
      auVar77._20_4_ = fVar213;
      auVar77._24_4_ = fVar213;
      auVar77._28_4_ = fVar213;
      auVar74 = vminps_avx(auVar74,auVar77);
      auVar74 = vmaxps_avx(auVar74,_DAT_02020f00);
      auVar97 = vsubps_avx(auVar9,auVar74);
      local_2c80 = vcvtps2dq_avx(auVar74);
      uVar50 = *(uint *)(local_2c80 + local_2b88 * 4);
      auVar91._4_4_ = uVar50;
      auVar91._0_4_ = uVar50;
      auVar91._8_4_ = uVar50;
      auVar91._12_4_ = uVar50;
      auVar91._16_4_ = uVar50;
      auVar91._20_4_ = uVar50;
      auVar91._24_4_ = uVar50;
      auVar91._28_4_ = uVar50;
      auVar95 = ZEXT436(uVar50);
      auVar74 = vpcmpeqd_avx2(auVar91,local_2c80);
      auVar74 = local_2900 & ~auVar74;
      fVar96 = auVar97._4_4_;
      fVar105 = auVar97._8_4_;
      fVar106 = auVar97._12_4_;
      fVar107 = auVar97._16_4_;
      fVar71 = auVar97._20_4_;
      fVar72 = auVar97._24_4_;
      fVar213 = auVar97._0_4_;
      auVar104._28_36_ = auVar203._28_36_;
      auVar131._28_36_ = in_ZMM12._28_36_;
      auVar145._28_36_ = in_ZMM13._28_36_;
      if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar74 >> 0x7f,0) == '\0') &&
            (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar74 >> 0xbf,0) == '\0') &&
          (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar74[0x1f])
      {
        lVar4 = *(long *)(*(long *)&pGVar3[2].numPrimitives + (long)(int)uVar50 * 0x38);
        lVar5 = *(long *)(*(long *)&pGVar3[2].numPrimitives + 0x38 + (long)(int)uVar50 * 0x38);
        uVar56 = (ulong)*(uint *)(puVar55 + uVar52 * 4);
        uVar54 = *(undefined4 *)(lVar4 + uVar56 * 4);
        auVar126._4_4_ = uVar54;
        auVar126._0_4_ = uVar54;
        auVar126._8_4_ = uVar54;
        auVar126._12_4_ = uVar54;
        auVar126._16_4_ = uVar54;
        auVar126._20_4_ = uVar54;
        auVar126._24_4_ = uVar54;
        auVar126._28_4_ = uVar54;
        uVar54 = *(undefined4 *)(lVar4 + 4 + uVar56 * 4);
        auVar141._4_4_ = uVar54;
        auVar141._0_4_ = uVar54;
        auVar141._8_4_ = uVar54;
        auVar141._12_4_ = uVar54;
        auVar141._16_4_ = uVar54;
        auVar141._20_4_ = uVar54;
        auVar141._24_4_ = uVar54;
        auVar141._28_4_ = uVar54;
        uVar54 = *(undefined4 *)(lVar4 + 8 + uVar56 * 4);
        auVar157._4_4_ = uVar54;
        auVar157._0_4_ = uVar54;
        auVar157._8_4_ = uVar54;
        auVar157._12_4_ = uVar54;
        auVar157._16_4_ = uVar54;
        auVar157._20_4_ = uVar54;
        auVar157._24_4_ = uVar54;
        auVar157._28_4_ = uVar54;
        fVar209 = *(float *)(lVar5 + uVar56 * 4);
        fVar211 = *(float *)(lVar5 + 4 + uVar56 * 4);
        fVar73 = *(float *)(lVar5 + 8 + uVar56 * 4);
        uVar56 = (ulong)*(uint *)(puVar55 + uVar52 * 4 + 0x10);
        auVar75._8_4_ = 0x3f800000;
        auVar75._0_8_ = &DAT_3f8000003f800000;
        auVar75._12_4_ = 0x3f800000;
        auVar75._16_4_ = 0x3f800000;
        auVar75._20_4_ = 0x3f800000;
        auVar75._24_4_ = 0x3f800000;
        auVar75._28_4_ = 0x3f800000;
        auVar74 = vsubps_avx(auVar75,auVar97);
        auVar14._4_4_ = fVar96 * fVar209;
        auVar14._0_4_ = fVar213 * fVar209;
        auVar14._8_4_ = fVar105 * fVar209;
        auVar14._12_4_ = fVar106 * fVar209;
        auVar14._16_4_ = fVar107 * fVar209;
        auVar14._20_4_ = fVar71 * fVar209;
        auVar14._24_4_ = fVar72 * fVar209;
        auVar14._28_4_ = fVar209;
        auVar15._4_4_ = fVar96 * fVar211;
        auVar15._0_4_ = fVar213 * fVar211;
        auVar15._8_4_ = fVar105 * fVar211;
        auVar15._12_4_ = fVar106 * fVar211;
        auVar15._16_4_ = fVar107 * fVar211;
        auVar15._20_4_ = fVar71 * fVar211;
        auVar15._24_4_ = fVar72 * fVar211;
        auVar15._28_4_ = fVar211;
        auVar16._4_4_ = fVar96 * fVar73;
        auVar16._0_4_ = fVar213 * fVar73;
        auVar16._8_4_ = fVar105 * fVar73;
        auVar16._12_4_ = fVar106 * fVar73;
        auVar16._16_4_ = fVar107 * fVar73;
        auVar16._20_4_ = fVar71 * fVar73;
        auVar16._24_4_ = fVar72 * fVar73;
        auVar16._28_4_ = fVar73;
        auVar89 = vfmadd231ps_fma(auVar14,auVar74,auVar126);
        auVar94 = ZEXT1664(auVar89);
        auVar89 = vfmadd231ps_fma(auVar15,auVar74,auVar141);
        auVar102 = ZEXT1632(auVar89);
        auVar89 = vfmadd231ps_fma(auVar16,auVar74,auVar157);
        auVar115 = ZEXT1664(auVar89);
        uVar54 = *(undefined4 *)(lVar4 + uVar56 * 4);
        auVar127._4_4_ = uVar54;
        auVar127._0_4_ = uVar54;
        auVar127._8_4_ = uVar54;
        auVar127._12_4_ = uVar54;
        auVar127._16_4_ = uVar54;
        auVar127._20_4_ = uVar54;
        auVar127._24_4_ = uVar54;
        auVar127._28_4_ = uVar54;
        uVar54 = *(undefined4 *)(lVar4 + 4 + uVar56 * 4);
        auVar142._4_4_ = uVar54;
        auVar142._0_4_ = uVar54;
        auVar142._8_4_ = uVar54;
        auVar142._12_4_ = uVar54;
        auVar142._16_4_ = uVar54;
        auVar142._20_4_ = uVar54;
        auVar142._24_4_ = uVar54;
        auVar142._28_4_ = uVar54;
        uVar54 = *(undefined4 *)(lVar4 + 8 + uVar56 * 4);
        auVar158._4_4_ = uVar54;
        auVar158._0_4_ = uVar54;
        auVar158._8_4_ = uVar54;
        auVar158._12_4_ = uVar54;
        auVar158._16_4_ = uVar54;
        auVar158._20_4_ = uVar54;
        auVar158._24_4_ = uVar54;
        auVar158._28_4_ = uVar54;
        fVar209 = *(float *)(lVar5 + uVar56 * 4);
        fVar211 = *(float *)(lVar5 + 4 + uVar56 * 4);
        fVar73 = *(float *)(lVar5 + 8 + uVar56 * 4);
        auVar104._0_4_ = fVar209 * fVar213;
        auVar104._4_4_ = fVar209 * fVar96;
        auVar104._8_4_ = fVar209 * fVar105;
        auVar104._12_4_ = fVar209 * fVar106;
        auVar104._16_4_ = fVar209 * fVar107;
        auVar104._20_4_ = fVar209 * fVar71;
        auVar104._24_4_ = fVar209 * fVar72;
        auVar131._0_4_ = fVar211 * fVar213;
        auVar131._4_4_ = fVar211 * fVar96;
        auVar131._8_4_ = fVar211 * fVar105;
        auVar131._12_4_ = fVar211 * fVar106;
        auVar131._16_4_ = fVar211 * fVar107;
        auVar131._20_4_ = fVar211 * fVar71;
        auVar131._24_4_ = fVar211 * fVar72;
        auVar145._0_4_ = fVar73 * fVar213;
        auVar145._4_4_ = fVar73 * fVar96;
        auVar145._8_4_ = fVar73 * fVar105;
        auVar145._12_4_ = fVar73 * fVar106;
        auVar145._16_4_ = fVar73 * fVar107;
        auVar145._20_4_ = fVar73 * fVar71;
        auVar145._24_4_ = fVar73 * fVar72;
        auVar89 = vfmadd231ps_fma(auVar104._0_32_,auVar74,auVar127);
        local_2d00 = ZEXT1632(auVar89);
        auVar89 = vfmadd231ps_fma(auVar131._0_32_,auVar74,auVar142);
        local_2ca0 = ZEXT1632(auVar89);
        uVar56 = (ulong)*(uint *)(puVar55 + uVar52 * 4 + 0x20);
        uVar54 = *(undefined4 *)(lVar4 + uVar56 * 4);
        auVar128._4_4_ = uVar54;
        auVar128._0_4_ = uVar54;
        auVar128._8_4_ = uVar54;
        auVar128._12_4_ = uVar54;
        auVar128._16_4_ = uVar54;
        auVar128._20_4_ = uVar54;
        auVar128._24_4_ = uVar54;
        auVar128._28_4_ = uVar54;
        uVar54 = *(undefined4 *)(lVar4 + 4 + uVar56 * 4);
        auVar143._4_4_ = uVar54;
        auVar143._0_4_ = uVar54;
        auVar143._8_4_ = uVar54;
        auVar143._12_4_ = uVar54;
        auVar143._16_4_ = uVar54;
        auVar143._20_4_ = uVar54;
        auVar143._24_4_ = uVar54;
        auVar143._28_4_ = uVar54;
        uVar54 = *(undefined4 *)(lVar4 + 8 + uVar56 * 4);
        auVar171._4_4_ = uVar54;
        auVar171._0_4_ = uVar54;
        auVar171._8_4_ = uVar54;
        auVar171._12_4_ = uVar54;
        auVar171._16_4_ = uVar54;
        auVar171._20_4_ = uVar54;
        auVar171._24_4_ = uVar54;
        auVar171._28_4_ = uVar54;
        fVar209 = *(float *)(lVar5 + uVar56 * 4);
        fVar211 = *(float *)(lVar5 + 4 + uVar56 * 4);
        auVar89 = vfmadd231ps_fma(auVar145._0_32_,auVar74,auVar158);
        _local_2b80 = ZEXT1632(auVar89);
        fVar73 = *(float *)(lVar5 + 8 + uVar56 * 4);
        auVar17._4_4_ = fVar209 * fVar96;
        auVar17._0_4_ = fVar209 * fVar213;
        auVar17._8_4_ = fVar209 * fVar105;
        auVar17._12_4_ = fVar209 * fVar106;
        auVar17._16_4_ = fVar209 * fVar107;
        auVar17._20_4_ = fVar209 * fVar71;
        auVar17._24_4_ = fVar209 * fVar72;
        auVar17._28_4_ = fVar209;
        auVar18._4_4_ = fVar211 * fVar96;
        auVar18._0_4_ = fVar211 * fVar213;
        auVar18._8_4_ = fVar211 * fVar105;
        auVar18._12_4_ = fVar211 * fVar106;
        auVar18._16_4_ = fVar211 * fVar107;
        auVar18._20_4_ = fVar211 * fVar71;
        auVar18._24_4_ = fVar211 * fVar72;
        auVar18._28_4_ = fVar211;
        auVar19._4_4_ = fVar96 * fVar73;
        auVar19._0_4_ = fVar213 * fVar73;
        auVar19._8_4_ = fVar105 * fVar73;
        auVar19._12_4_ = fVar106 * fVar73;
        auVar19._16_4_ = fVar107 * fVar73;
        auVar19._20_4_ = fVar71 * fVar73;
        auVar19._24_4_ = fVar72 * fVar73;
        auVar19._28_4_ = fVar73;
        auVar89 = vfmadd231ps_fma(auVar17,auVar74,auVar128);
        _local_2bc0 = ZEXT1632(auVar89);
        auVar89 = vfmadd231ps_fma(auVar18,auVar74,auVar143);
        _local_2ae0 = ZEXT1632(auVar89);
        auVar89 = vfmadd231ps_fma(auVar19,auVar74,auVar171);
        _local_2b00 = ZEXT1632(auVar89);
        uVar56 = (ulong)*(uint *)(puVar55 + uVar52 * 4 + 0x30);
        uVar54 = *(undefined4 *)(lVar4 + uVar56 * 4);
        auVar129._4_4_ = uVar54;
        auVar129._0_4_ = uVar54;
        auVar129._8_4_ = uVar54;
        auVar129._12_4_ = uVar54;
        auVar129._16_4_ = uVar54;
        auVar129._20_4_ = uVar54;
        auVar129._24_4_ = uVar54;
        auVar129._28_4_ = uVar54;
        fVar209 = *(float *)(lVar5 + uVar56 * 4);
        fVar211 = *(float *)(lVar5 + 4 + uVar56 * 4);
        fVar73 = *(float *)(lVar5 + 8 + uVar56 * 4);
        auVar193._0_4_ = fVar213 * fVar209;
        auVar193._4_4_ = fVar96 * fVar209;
        auVar193._8_4_ = fVar105 * fVar209;
        auVar193._12_4_ = fVar106 * fVar209;
        auVar193._16_4_ = fVar107 * fVar209;
        auVar193._20_4_ = fVar71 * fVar209;
        auVar193._24_4_ = fVar72 * fVar209;
        auVar193._28_4_ = 0;
        auVar20._4_4_ = fVar96 * fVar211;
        auVar20._0_4_ = fVar213 * fVar211;
        auVar20._8_4_ = fVar105 * fVar211;
        auVar20._12_4_ = fVar106 * fVar211;
        auVar20._16_4_ = fVar107 * fVar211;
        auVar20._20_4_ = fVar71 * fVar211;
        auVar20._24_4_ = fVar72 * fVar211;
        auVar20._28_4_ = fVar209;
        auVar21._4_4_ = fVar73 * fVar96;
        auVar21._0_4_ = fVar73 * fVar213;
        auVar21._8_4_ = fVar73 * fVar105;
        auVar21._12_4_ = fVar73 * fVar106;
        auVar21._16_4_ = fVar73 * fVar107;
        auVar21._20_4_ = fVar73 * fVar71;
        auVar21._24_4_ = fVar73 * fVar72;
        auVar21._28_4_ = fVar211;
        auVar89 = vfmadd231ps_fma(auVar193,auVar74,auVar129);
        _local_2980 = ZEXT1632(auVar89);
        uVar54 = *(undefined4 *)(lVar4 + 4 + uVar56 * 4);
        auVar64._4_4_ = uVar54;
        auVar64._0_4_ = uVar54;
        auVar64._8_4_ = uVar54;
        auVar64._12_4_ = uVar54;
        auVar64._16_4_ = uVar54;
        auVar64._20_4_ = uVar54;
        auVar64._24_4_ = uVar54;
        auVar64._28_4_ = uVar54;
        auVar89 = vfmadd231ps_fma(auVar20,auVar74,auVar64);
        auVar104 = ZEXT1664(auVar89);
        uVar54 = *(undefined4 *)(lVar4 + 8 + uVar56 * 4);
        auVar65._4_4_ = uVar54;
        auVar65._0_4_ = uVar54;
        auVar65._8_4_ = uVar54;
        auVar65._12_4_ = uVar54;
        auVar65._16_4_ = uVar54;
        auVar65._20_4_ = uVar54;
        auVar65._24_4_ = uVar54;
        auVar65._28_4_ = uVar54;
        auVar89 = vfmadd231ps_fma(auVar21,auVar74,auVar65);
        auVar161 = ZEXT1664(auVar89);
      }
      else {
        if (uVar53 != 0) {
          lVar4 = *(long *)&pGVar3[2].numPrimitives;
          uVar50 = *(uint *)(puVar55 + uVar52 * 4);
          uVar56 = local_2d08;
          uVar58 = uVar53;
          do {
            auVar89 = *(undefined1 (*) [16])
                       (*(long *)(lVar4 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                       (ulong)uVar50 * 4);
            auVar8 = *(undefined1 (*) [16])
                      (*(long *)(lVar4 + 0x38 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                      (ulong)uVar50 * 4);
            auVar95 = (undefined1  [36])0x0;
            *(int *)(local_2ac0 + uVar56 * 4) = auVar89._0_4_;
            uVar54 = vextractps_avx(auVar89,1);
            *(undefined4 *)((long)&local_2aa0 + uVar56 * 4) = uVar54;
            uVar54 = vextractps_avx(auVar89,2);
            *(undefined4 *)(local_2a80 + uVar56 * 4) = uVar54;
            *(int *)(local_2c60 + uVar56 * 4) = auVar8._0_4_;
            *(int *)((long)&local_2c40 + uVar56 * 4) = auVar8._4_4_;
            local_2c20[uVar56] = auVar8._8_4_;
            uVar58 = uVar58 ^ 1L << (uVar56 & 0x3f);
            uVar56 = 0;
            for (uVar10 = uVar58; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              uVar56 = uVar56 + 1;
            }
          } while (uVar58 != 0);
        }
        auVar78._8_4_ = 0x3f800000;
        auVar78._0_8_ = &DAT_3f8000003f800000;
        auVar78._12_4_ = 0x3f800000;
        auVar78._16_4_ = 0x3f800000;
        auVar78._20_4_ = 0x3f800000;
        auVar78._24_4_ = 0x3f800000;
        auVar78._28_4_ = 0x3f800000;
        auVar74 = vsubps_avx(auVar78,auVar97);
        fVar73 = auVar74._0_4_;
        auVar94._0_4_ = fVar73 * (float)local_2ac0._0_4_;
        fVar83 = auVar74._4_4_;
        auVar94._4_4_ = fVar83 * (float)local_2ac0._4_4_;
        fVar84 = auVar74._8_4_;
        auVar94._8_4_ = fVar84 * fStack_2ab8;
        fVar85 = auVar74._12_4_;
        auVar94._12_4_ = fVar85 * fStack_2ab4;
        fVar86 = auVar74._16_4_;
        auVar94._16_4_ = fVar86 * fStack_2ab0;
        fVar87 = auVar74._20_4_;
        auVar94._20_4_ = fVar87 * fStack_2aac;
        fVar88 = auVar74._24_4_;
        auVar94._24_4_ = fVar88 * fStack_2aa8;
        auVar94._28_36_ = auVar95;
        _local_2b80 = auVar94._0_32_;
        uVar54 = auVar95._0_4_;
        local_2bc0._4_4_ = fVar83 * local_2aa0._4_4_;
        local_2bc0._0_4_ = fVar73 * (float)local_2aa0;
        fStack_2bb8 = fVar84 * (float)uStack_2a98;
        fStack_2bb4 = fVar85 * uStack_2a98._4_4_;
        fStack_2bb0 = fVar86 * (float)uStack_2a90;
        fStack_2bac = fVar87 * uStack_2a90._4_4_;
        fStack_2ba8 = fVar88 * (float)uStack_2a88;
        fStack_2ba4 = (float)uVar54;
        local_2ae0._4_4_ = fVar83 * (float)local_2a80._4_4_;
        local_2ae0._0_4_ = fVar73 * (float)local_2a80._0_4_;
        fStack_2ad8 = fVar84 * fStack_2a78;
        fStack_2ad4 = fVar85 * fStack_2a74;
        fStack_2ad0 = fVar86 * fStack_2a70;
        fStack_2acc = fVar87 * fStack_2a6c;
        fStack_2ac8 = fVar88 * fStack_2a68;
        fStack_2ac4 = (float)uVar54;
        local_2b00._4_4_ = fVar96 * (float)local_2c60._4_4_;
        local_2b00._0_4_ = fVar213 * (float)local_2c60._0_4_;
        fStack_2af8 = fVar105 * (float)uStack_2c58;
        fStack_2af4 = fVar106 * uStack_2c58._4_4_;
        fStack_2af0 = fVar107 * (float)uStack_2c50;
        fStack_2aec = fVar71 * uStack_2c50._4_4_;
        fStack_2ae8 = fVar72 * pRStack_2c48._0_4_;
        fStack_2ae4 = (float)uVar54;
        local_2980._4_4_ = fVar96 * local_2c40._4_4_;
        local_2980._0_4_ = fVar213 * (float)local_2c40;
        fStack_2978 = fVar105 * fStack_2c38;
        fStack_2974 = fVar106 * fStack_2c34;
        fStack_2970 = fVar107 * fStack_2c30;
        fStack_296c = fVar71 * fStack_2c2c;
        fStack_2968 = fVar72 * fStack_2c28;
        fStack_2964 = (float)uVar54;
        fVar108 = fVar213 * local_2c20[0];
        fVar116 = fVar96 * local_2c20[1];
        fVar117 = fVar105 * local_2c20[2];
        fVar118 = fVar106 * local_2c20[3];
        fVar119 = fVar107 * fStack_2c10;
        fVar120 = fVar71 * fStack_2c0c;
        fVar121 = fVar72 * fStack_2c08;
        if (uVar53 != 0) {
          lVar4 = *(long *)&pGVar3[2].numPrimitives;
          uVar50 = *(uint *)(puVar55 + uVar52 * 4 + 0x10);
          uVar56 = local_2d08;
          uVar58 = uVar53;
          do {
            auVar89 = *(undefined1 (*) [16])
                       (*(long *)(lVar4 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                       (ulong)uVar50 * 4);
            fVar209 = 0.0;
            auVar8 = *(undefined1 (*) [16])
                      (*(long *)(lVar4 + 0x38 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                      (ulong)uVar50 * 4);
            fVar211 = 0.0;
            *(int *)(local_2ac0 + uVar56 * 4) = auVar89._0_4_;
            uVar2 = vextractps_avx(auVar89,1);
            *(undefined4 *)((long)&local_2aa0 + uVar56 * 4) = uVar2;
            uVar2 = vextractps_avx(auVar89,2);
            *(undefined4 *)(local_2a80 + uVar56 * 4) = uVar2;
            *(int *)(local_2c60 + uVar56 * 4) = auVar8._0_4_;
            uVar2 = vextractps_avx(auVar8,1);
            *(undefined4 *)((long)&local_2c40 + uVar56 * 4) = uVar2;
            fVar181 = (float)vextractps_avx(auVar8,2);
            local_2c20[uVar56] = fVar181;
            uVar58 = uVar58 ^ 1L << (uVar56 & 0x3f);
            uVar56 = 0;
            for (uVar10 = uVar58; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              uVar56 = uVar56 + 1;
            }
          } while (uVar58 != 0);
        }
        local_29a0._4_4_ = fVar83 * (float)local_2ac0._4_4_;
        local_29a0._0_4_ = fVar73 * (float)local_2ac0._0_4_;
        fStack_2998 = fVar84 * fStack_2ab8;
        fStack_2994 = fVar85 * fStack_2ab4;
        fStack_2990 = fVar86 * fStack_2ab0;
        fStack_298c = fVar87 * fStack_2aac;
        fStack_2988 = fVar88 * fStack_2aa8;
        fStack_2984 = (float)uVar54;
        fVar181 = fVar73 * (float)local_2aa0;
        fVar184 = fVar83 * local_2aa0._4_4_;
        fVar185 = fVar84 * (float)uStack_2a98;
        fVar186 = fVar85 * uStack_2a98._4_4_;
        fVar187 = fVar86 * (float)uStack_2a90;
        fVar188 = fVar87 * uStack_2a90._4_4_;
        fVar189 = fVar88 * (float)uStack_2a88;
        fVar190 = fVar73 * (float)local_2a80._0_4_;
        fVar195 = fVar83 * (float)local_2a80._4_4_;
        fVar196 = fVar84 * fStack_2a78;
        fVar197 = fVar85 * fStack_2a74;
        fVar198 = fVar86 * fStack_2a70;
        fVar199 = fVar87 * fStack_2a6c;
        fVar200 = fVar88 * fStack_2a68;
        fVar202 = fVar213 * (float)local_2c60._0_4_;
        fVar204 = fVar96 * (float)local_2c60._4_4_;
        fVar206 = fVar105 * (float)uStack_2c58;
        fVar208 = fVar106 * uStack_2c58._4_4_;
        fVar210 = fVar107 * (float)uStack_2c50;
        fVar212 = fVar71 * uStack_2c50._4_4_;
        fVar214 = fVar72 * pRStack_2c48._0_4_;
        fVar215 = fVar213 * (float)local_2c40;
        fVar216 = fVar96 * local_2c40._4_4_;
        fVar217 = fVar105 * fStack_2c38;
        fVar219 = fVar106 * fStack_2c34;
        fVar220 = fVar107 * fStack_2c30;
        fVar221 = fVar71 * fStack_2c2c;
        fVar222 = fVar72 * fStack_2c28;
        fVar223 = fVar213 * local_2c20[0];
        fVar226 = fVar96 * local_2c20[1];
        fVar227 = fVar105 * local_2c20[2];
        fVar228 = fVar106 * local_2c20[3];
        fVar229 = fVar107 * fStack_2c10;
        fVar230 = fVar71 * fStack_2c0c;
        fVar231 = fVar72 * fStack_2c08;
        if (uVar53 != 0) {
          lVar4 = *(long *)&pGVar3[2].numPrimitives;
          uVar50 = *(uint *)(puVar55 + uVar52 * 4 + 0x20);
          uVar56 = local_2d08;
          uVar58 = uVar53;
          do {
            auVar89 = *(undefined1 (*) [16])
                       (*(long *)(lVar4 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                       (ulong)uVar50 * 4);
            fVar209 = 0.0;
            auVar8 = *(undefined1 (*) [16])
                      (*(long *)(lVar4 + 0x38 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                      (ulong)uVar50 * 4);
            fVar211 = 0.0;
            *(int *)(local_2ac0 + uVar56 * 4) = auVar89._0_4_;
            uVar54 = vextractps_avx(auVar89,1);
            *(undefined4 *)((long)&local_2aa0 + uVar56 * 4) = uVar54;
            uVar54 = vextractps_avx(auVar89,2);
            *(undefined4 *)(local_2a80 + uVar56 * 4) = uVar54;
            *(int *)(local_2c60 + uVar56 * 4) = auVar8._0_4_;
            uVar54 = vextractps_avx(auVar8,1);
            *(undefined4 *)((long)&local_2c40 + uVar56 * 4) = uVar54;
            fVar122 = (float)vextractps_avx(auVar8,2);
            local_2c20[uVar56] = fVar122;
            uVar58 = uVar58 ^ 1L << (uVar56 & 0x3f);
            uVar56 = 0;
            for (uVar10 = uVar58; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              uVar56 = uVar56 + 1;
            }
          } while (uVar58 != 0);
        }
        fVar122 = fVar73 * (float)local_2ac0._0_4_;
        fVar132 = fVar83 * (float)local_2ac0._4_4_;
        fVar133 = fVar84 * fStack_2ab8;
        fVar134 = fVar85 * fStack_2ab4;
        fVar135 = fVar86 * fStack_2ab0;
        fVar136 = fVar87 * fStack_2aac;
        fVar137 = fVar88 * fStack_2aa8;
        fVar138 = fVar73 * (float)local_2aa0;
        fVar146 = fVar83 * local_2aa0._4_4_;
        fVar147 = fVar84 * (float)uStack_2a98;
        fVar148 = fVar85 * uStack_2a98._4_4_;
        fVar149 = fVar86 * (float)uStack_2a90;
        fVar150 = fVar87 * uStack_2a90._4_4_;
        fVar151 = fVar88 * (float)uStack_2a88;
        fVar232 = fVar73 * (float)local_2a80._0_4_;
        fVar234 = fVar83 * (float)local_2a80._4_4_;
        fVar235 = fVar84 * fStack_2a78;
        fVar236 = fVar85 * fStack_2a74;
        fVar237 = fVar86 * fStack_2a70;
        fVar238 = fVar87 * fStack_2a6c;
        fVar239 = fVar88 * fStack_2a68;
        fVar152 = fVar213 * (float)local_2c60._0_4_;
        fVar162 = fVar96 * (float)local_2c60._4_4_;
        fVar163 = fVar105 * (float)uStack_2c58;
        fVar164 = fVar106 * uStack_2c58._4_4_;
        fVar165 = fVar107 * (float)uStack_2c50;
        fVar166 = fVar71 * uStack_2c50._4_4_;
        fVar167 = fVar72 * pRStack_2c48._0_4_;
        fVar168 = fVar213 * (float)local_2c40;
        fVar175 = fVar96 * local_2c40._4_4_;
        fVar176 = fVar105 * fStack_2c38;
        fVar177 = fVar106 * fStack_2c34;
        fVar178 = fVar107 * fStack_2c30;
        fVar179 = fVar71 * fStack_2c2c;
        fVar180 = fVar72 * fStack_2c28;
        fVar240 = fVar213 * local_2c20[0];
        fVar242 = fVar96 * local_2c20[1];
        fVar243 = fVar105 * local_2c20[2];
        fVar244 = fVar106 * local_2c20[3];
        fVar245 = fVar107 * fStack_2c10;
        fVar246 = fVar71 * fStack_2c0c;
        fVar247 = fVar72 * fStack_2c08;
        auVar248 = ZEXT436((uint)auVar241._28_4_);
        if (uVar53 != 0) {
          lVar4 = *(long *)&pGVar3[2].numPrimitives;
          uVar50 = *(uint *)(puVar55 + uVar52 * 4 + 0x30);
          uVar56 = local_2d08;
          uVar58 = uVar53;
          do {
            auVar89 = *(undefined1 (*) [16])
                       (*(long *)(lVar4 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                       (ulong)uVar50 * 4);
            puVar1 = (undefined4 *)
                     (*(long *)(lVar4 + 0x38 + (long)*(int *)(local_2c80 + uVar56 * 4) * 0x38) +
                     (ulong)uVar50 * 4);
            uVar2 = *puVar1;
            uVar44 = puVar1[1];
            fVar45 = (float)puVar1[2];
            *(int *)(local_2ac0 + uVar56 * 4) = auVar89._0_4_;
            uVar54 = vextractps_avx(auVar89,1);
            *(undefined4 *)((long)&local_2aa0 + uVar56 * 4) = uVar54;
            uVar54 = vextractps_avx(auVar89,2);
            *(undefined4 *)(local_2a80 + uVar56 * 4) = uVar54;
            *(undefined4 *)(local_2c60 + uVar56 * 4) = uVar2;
            *(undefined4 *)((long)&local_2c40 + uVar56 * 4) = uVar44;
            local_2c20[uVar56] = fVar45;
            uVar58 = uVar58 ^ 1L << (uVar56 & 0x3f);
            uVar56 = 0;
            for (uVar10 = uVar58; (uVar10 & 1) == 0; uVar10 = uVar10 >> 1 | 0x8000000000000000) {
              uVar56 = uVar56 + 1;
            }
          } while (uVar58 != 0);
        }
        auVar94 = ZEXT3264(CONCAT428(fStack_2ae4 + fStack_2b64,
                                     CONCAT424(fStack_2ae8 + fStack_2b68,
                                               CONCAT420(fStack_2aec + fStack_2b6c,
                                                         CONCAT416(fStack_2af0 + fStack_2b70,
                                                                   CONCAT412(fStack_2af4 +
                                                                             fStack_2b74,
                                                                             CONCAT48(fStack_2af8 +
                                                                                      fStack_2b78,
                                                                                      CONCAT44((
                                                  float)local_2b00._4_4_ + (float)local_2b80._4_4_,
                                                  (float)local_2b00._0_4_ + (float)local_2b80._0_4_)
                                                  )))))));
        auVar102._0_4_ = (float)local_2980._0_4_ + (float)local_2bc0._0_4_;
        auVar102._4_4_ = (float)local_2980._4_4_ + (float)local_2bc0._4_4_;
        auVar102._8_4_ = fStack_2978 + fStack_2bb8;
        auVar102._12_4_ = fStack_2974 + fStack_2bb4;
        auVar102._16_4_ = fStack_2970 + fStack_2bb0;
        auVar102._20_4_ = fStack_296c + fStack_2bac;
        auVar102._24_4_ = fStack_2968 + fStack_2ba8;
        auVar102._28_4_ = fStack_2964 + fStack_2ba4;
        auVar115 = ZEXT3264(CONCAT428(auVar115._28_4_ + fStack_2ac4,
                                      CONCAT424(fVar121 + fStack_2ac8,
                                                CONCAT420(fVar120 + fStack_2acc,
                                                          CONCAT416(fVar119 + fStack_2ad0,
                                                                    CONCAT412(fVar118 + fStack_2ad4,
                                                                              CONCAT48(fVar117 + 
                                                  fStack_2ad8,
                                                  CONCAT44(fVar116 + (float)local_2ae0._4_4_,
                                                           fVar108 + (float)local_2ae0._0_4_))))))))
        ;
        local_2d00._0_4_ = fVar202 + (float)local_29a0._0_4_;
        local_2d00._4_4_ = fVar204 + (float)local_29a0._4_4_;
        local_2d00._8_4_ = fVar206 + fStack_2998;
        local_2d00._12_4_ = fVar208 + fStack_2994;
        local_2d00._16_4_ = fVar210 + fStack_2990;
        local_2d00._20_4_ = fVar212 + fStack_298c;
        local_2d00._24_4_ = fVar214 + fStack_2988;
        local_2d00._28_4_ = auVar203._28_4_ + fStack_2984;
        local_2ca0._0_4_ = fVar181 + fVar215;
        local_2ca0._4_4_ = fVar184 + fVar216;
        local_2ca0._8_4_ = fVar185 + fVar217;
        local_2ca0._12_4_ = fVar186 + fVar219;
        local_2ca0._16_4_ = fVar187 + fVar220;
        local_2ca0._20_4_ = fVar188 + fVar221;
        local_2ca0._24_4_ = fVar189 + fVar222;
        local_2ca0._28_4_ = auVar183._28_4_ + in_ZMM12._28_4_;
        local_2b80._0_4_ = fVar190 + fVar223;
        local_2b80._4_4_ = fVar195 + fVar226;
        fStack_2b78 = fVar196 + fVar227;
        fStack_2b74 = fVar197 + fVar228;
        fStack_2b70 = fVar198 + fVar229;
        fStack_2b6c = fVar199 + fVar230;
        fStack_2b68 = fVar200 + fVar231;
        fStack_2b64 = auVar194._28_4_ + in_ZMM13._28_4_;
        local_2bc0._4_4_ = fVar132 + fVar162;
        local_2bc0._0_4_ = fVar122 + fVar152;
        fStack_2bb8 = fVar133 + fVar163;
        fStack_2bb4 = fVar134 + fVar164;
        fStack_2bb0 = fVar135 + fVar165;
        fStack_2bac = fVar136 + fVar166;
        fStack_2ba8 = fVar137 + fVar167;
        fStack_2ba4 = fVar209 + auVar161._28_4_;
        fStack_2ac4 = auVar174._28_4_ + fVar211;
        local_2ae0._4_4_ = fVar175 + fVar146;
        local_2ae0._0_4_ = fVar168 + fVar138;
        fStack_2ad8 = fVar176 + fVar147;
        fStack_2ad4 = fVar177 + fVar148;
        fStack_2ad0 = fVar178 + fVar149;
        fStack_2acc = fVar179 + fVar150;
        fStack_2ac8 = fVar180 + fVar151;
        local_2b00._4_4_ = fVar234 + fVar242;
        local_2b00._0_4_ = fVar232 + fVar240;
        fStack_2af8 = fVar235 + fVar243;
        fStack_2af4 = fVar236 + fVar244;
        fStack_2af0 = fVar237 + fVar245;
        fStack_2aec = fVar238 + fVar246;
        fStack_2ae8 = fVar239 + fVar247;
        fStack_2ae4 = auVar233._28_4_ + auVar241._28_4_;
        local_2980._0_4_ = fVar73 * (float)local_2ac0._0_4_ + fVar213 * (float)local_2c60._0_4_;
        local_2980._4_4_ = fVar83 * (float)local_2ac0._4_4_ + fVar96 * (float)local_2c60._4_4_;
        fStack_2978 = fVar84 * fStack_2ab8 + fVar105 * (float)uStack_2c58;
        fStack_2974 = fVar85 * fStack_2ab4 + fVar106 * uStack_2c58._4_4_;
        fStack_2970 = fVar86 * fStack_2ab0 + fVar107 * (float)uStack_2c50;
        fStack_296c = fVar87 * fStack_2aac + fVar71 * uStack_2c50._4_4_;
        fStack_2968 = fVar88 * fStack_2aa8 + fVar72 * pRStack_2c48._0_4_;
        fStack_2964 = fStack_2ac4 + auVar161._28_4_;
        auVar129._4_4_ = fVar96 * local_2c40._4_4_;
        auVar129._0_4_ = fVar213 * (float)local_2c40;
        auVar129._8_4_ = fVar105 * fStack_2c38;
        auVar129._12_4_ = fVar106 * fStack_2c34;
        auVar129._16_4_ = fVar107 * fStack_2c30;
        auVar129._20_4_ = fVar71 * fStack_2c2c;
        auVar129._24_4_ = fVar72 * fStack_2c28;
        auVar129._28_4_ = fStack_2ac4;
        auVar104 = ZEXT3264(CONCAT428(fVar211 + fStack_2ac4,
                                      CONCAT424(fVar88 * (float)uStack_2a88 + fVar72 * fStack_2c28,
                                                CONCAT420(fVar87 * uStack_2a90._4_4_ +
                                                          fVar71 * fStack_2c2c,
                                                          CONCAT416(fVar86 * (float)uStack_2a90 +
                                                                    fVar107 * fStack_2c30,
                                                                    CONCAT412(fVar85 * uStack_2a98.
                                                                                       _4_4_ +
                                                                              fVar106 * fStack_2c34,
                                                                              CONCAT48(fVar84 * (
                                                  float)uStack_2a98 + fVar105 * fStack_2c38,
                                                  CONCAT44(fVar83 * local_2aa0._4_4_ +
                                                           fVar96 * local_2c40._4_4_,
                                                           fVar73 * (float)local_2aa0 +
                                                           fVar213 * (float)local_2c40))))))));
        auVar161 = ZEXT3264(CONCAT428(auVar74._28_4_ + auVar97._28_4_,
                                      CONCAT424(fVar88 * fStack_2a68 + fVar72 * fStack_2c08,
                                                CONCAT420(fVar87 * fStack_2a6c +
                                                          fVar71 * fStack_2c0c,
                                                          CONCAT416(fVar86 * fStack_2a70 +
                                                                    fVar107 * fStack_2c10,
                                                                    CONCAT412(fVar85 * fStack_2a74 +
                                                                              fVar106 * local_2c20
                                                                                        [3],
                                                                              CONCAT48(fVar84 * 
                                                  fStack_2a78 + fVar105 * local_2c20[2],
                                                  CONCAT44(fVar83 * (float)local_2a80._4_4_ +
                                                           fVar96 * local_2c20[1],
                                                           fVar73 * (float)local_2a80._0_4_ +
                                                           fVar213 * local_2c20[0]))))))));
      }
      auVar62 = local_28a0;
      auVar74 = auVar94._0_32_;
      local_2be0 = vsubps_avx(auVar74,local_2d00);
      local_2b20 = vsubps_avx(auVar102,local_2ca0);
      auVar97 = auVar115._0_32_;
      auVar109 = vsubps_avx(auVar97,_local_2b80);
      auVar203 = ZEXT3264(auVar109);
      auVar110 = vsubps_avx(_local_2980,auVar74);
      _local_29a0 = auVar104._0_32_;
      auVar191 = vsubps_avx(auVar104._0_32_,auVar102);
      local_2860 = auVar161._0_32_;
      auVar192 = vsubps_avx(auVar161._0_32_,auVar97);
      auVar43._4_4_ = auVar192._4_4_ * local_2b20._4_4_;
      auVar43._0_4_ = auVar192._0_4_ * local_2b20._0_4_;
      auVar43._8_4_ = auVar192._8_4_ * local_2b20._8_4_;
      auVar43._12_4_ = auVar192._12_4_ * local_2b20._12_4_;
      auVar43._16_4_ = auVar192._16_4_ * local_2b20._16_4_;
      auVar43._20_4_ = auVar192._20_4_ * local_2b20._20_4_;
      auVar43._24_4_ = auVar192._24_4_ * local_2b20._24_4_;
      auVar43._28_4_ = auVar129._28_4_;
      auVar11 = vfmsub231ps_fma(auVar43,auVar191,auVar109);
      auVar131 = ZEXT1664(auVar11);
      auVar174._0_4_ = auVar109._0_4_ * auVar110._0_4_;
      auVar174._4_4_ = auVar109._4_4_ * auVar110._4_4_;
      auVar174._8_4_ = auVar109._8_4_ * auVar110._8_4_;
      auVar174._12_4_ = auVar109._12_4_ * auVar110._12_4_;
      auVar174._16_4_ = auVar109._16_4_ * auVar110._16_4_;
      auVar174._20_4_ = auVar109._20_4_ * auVar110._20_4_;
      auVar174._28_36_ = auVar104._28_36_;
      auVar174._24_4_ = auVar109._24_4_ * auVar110._24_4_;
      auVar12 = vfmsub231ps_fma(auVar174._0_32_,auVar192,local_2be0);
      auVar145 = ZEXT1664(auVar12);
      auVar194._0_4_ = auVar191._0_4_ * local_2be0._0_4_;
      auVar194._4_4_ = auVar191._4_4_ * local_2be0._4_4_;
      auVar194._8_4_ = auVar191._8_4_ * local_2be0._8_4_;
      auVar194._12_4_ = auVar191._12_4_ * local_2be0._12_4_;
      auVar194._16_4_ = auVar191._16_4_ * local_2be0._16_4_;
      auVar194._20_4_ = auVar191._20_4_ * local_2be0._20_4_;
      auVar194._28_36_ = auVar161._28_36_;
      auVar194._24_4_ = auVar191._24_4_ * local_2be0._24_4_;
      auVar93 = vsubps_avx(auVar74,*(undefined1 (*) [32])ray);
      auVar174 = ZEXT3264(auVar93);
      auVar70 = vsubps_avx(auVar102,*(undefined1 (*) [32])(ray + 0x20));
      auVar183 = ZEXT3264(auVar70);
      auVar13 = vfmsub231ps_fma(auVar194._0_32_,auVar110,local_2b20);
      auVar161 = ZEXT1664(auVar13);
      auVar9 = vsubps_avx(auVar97,*(undefined1 (*) [32])(ray + 0x40));
      auVar194 = ZEXT3264(auVar9);
      auVar74 = *(undefined1 (*) [32])(ray + 0x80);
      auVar97 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar98 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar233._0_4_ = auVar70._0_4_ * auVar74._0_4_;
      auVar233._4_4_ = auVar70._4_4_ * auVar74._4_4_;
      auVar233._8_4_ = auVar70._8_4_ * auVar74._8_4_;
      auVar233._12_4_ = auVar70._12_4_ * auVar74._12_4_;
      auVar233._16_4_ = auVar70._16_4_ * auVar74._16_4_;
      auVar233._20_4_ = auVar70._20_4_ * auVar74._20_4_;
      auVar233._28_36_ = auVar94._28_36_;
      auVar233._24_4_ = auVar70._24_4_ * auVar74._24_4_;
      auVar153 = vfmsub231ps_fma(auVar233._0_32_,auVar93,auVar97);
      auVar95 = (undefined1  [36])0x0;
      auVar241._0_4_ = auVar13._0_4_ * auVar98._0_4_;
      auVar241._4_4_ = auVar13._4_4_ * auVar98._4_4_;
      auVar241._8_4_ = auVar13._8_4_ * auVar98._8_4_;
      auVar241._12_4_ = auVar13._12_4_ * auVar98._12_4_;
      auVar241._16_4_ = auVar98._16_4_ * 0.0;
      auVar241._20_4_ = auVar98._20_4_ * 0.0;
      auVar241._28_36_ = auVar115._28_36_;
      auVar241._24_4_ = auVar98._24_4_ * 0.0;
      auVar77 = ZEXT1632(auVar12);
      auVar89 = vfmadd231ps_fma(auVar241._0_32_,auVar77,auVar97);
      auVar115._0_4_ = auVar9._0_4_ * auVar97._0_4_;
      auVar115._4_4_ = auVar9._4_4_ * auVar97._4_4_;
      auVar115._8_4_ = auVar9._8_4_ * auVar97._8_4_;
      auVar115._12_4_ = auVar9._12_4_ * auVar97._12_4_;
      auVar115._16_4_ = auVar9._16_4_ * auVar97._16_4_;
      auVar115._20_4_ = auVar9._20_4_ * auVar97._20_4_;
      auVar115._24_4_ = auVar9._24_4_ * auVar97._24_4_;
      auVar115._28_36_ = auVar248;
      auVar123 = vfmsub231ps_fma(auVar115._0_32_,auVar70,auVar98);
      auVar241 = ZEXT1664(auVar123);
      auVar22._4_4_ = auVar93._4_4_ * auVar98._4_4_;
      auVar22._0_4_ = auVar93._0_4_ * auVar98._0_4_;
      auVar22._8_4_ = auVar93._8_4_ * auVar98._8_4_;
      auVar22._12_4_ = auVar93._12_4_ * auVar98._12_4_;
      auVar22._16_4_ = auVar93._16_4_ * auVar98._16_4_;
      auVar22._20_4_ = auVar93._20_4_ * auVar98._20_4_;
      auVar22._24_4_ = auVar93._24_4_ * auVar98._24_4_;
      auVar22._28_4_ = auVar97._28_4_;
      auVar139 = vfmsub231ps_fma(auVar22,auVar9,auVar74);
      auVar63 = ZEXT1632(auVar11);
      auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar63,auVar74);
      auVar115 = ZEXT1664(auVar89);
      auVar23._4_4_ = auVar192._4_4_ * auVar153._4_4_;
      auVar23._0_4_ = auVar192._0_4_ * auVar153._0_4_;
      auVar23._8_4_ = auVar192._8_4_ * auVar153._8_4_;
      auVar23._12_4_ = auVar192._12_4_ * auVar153._12_4_;
      auVar23._16_4_ = auVar192._16_4_ * 0.0;
      auVar23._20_4_ = auVar192._20_4_ * 0.0;
      auVar23._24_4_ = auVar192._24_4_ * 0.0;
      auVar23._28_4_ = auVar74._28_4_;
      auVar8 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar139),auVar191);
      auVar76._8_4_ = 0x80000000;
      auVar76._0_8_ = 0x8000000080000000;
      auVar76._12_4_ = 0x80000000;
      auVar76._16_4_ = 0x80000000;
      auVar76._20_4_ = 0x80000000;
      auVar76._24_4_ = 0x80000000;
      auVar76._28_4_ = 0x80000000;
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar123),auVar110);
      auVar74 = vandps_avx(ZEXT1632(auVar89),auVar76);
      in_ZMM12 = ZEXT3264(auVar74);
      uVar50 = auVar74._0_4_;
      auVar224._0_4_ = (float)(uVar50 ^ auVar8._0_4_);
      uVar205 = auVar74._4_4_;
      auVar224._4_4_ = (float)(uVar205 ^ auVar8._4_4_);
      uVar207 = auVar74._8_4_;
      auVar224._8_4_ = (float)(uVar207 ^ auVar8._8_4_);
      uVar218 = auVar74._12_4_;
      auVar224._12_4_ = (float)(uVar218 ^ auVar8._12_4_);
      fVar209 = auVar74._16_4_;
      auVar225._16_4_ = fVar209;
      auVar225._0_16_ = auVar224;
      fVar211 = auVar74._20_4_;
      auVar225._20_4_ = fVar211;
      fVar213 = auVar74._24_4_;
      auVar225._24_4_ = fVar213;
      uVar54 = auVar74._28_4_;
      auVar225._28_4_ = uVar54;
      in_ZMM13 = ZEXT3264(auVar225);
      auVar97 = vcmpps_avx(auVar225,_DAT_02020f00,5);
      auVar94 = ZEXT3264(auVar66);
      auVar98 = auVar66 & auVar97;
      local_2ce0._0_32_ = auVar66;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0x7f,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar98 >> 0xbf,0) == '\0') &&
          (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar98[0x1f])
      {
        auVar233 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar66 = vpcmpeqd_avx2(ZEXT1632(auVar139),ZEXT1632(auVar139));
        auVar104 = ZEXT3264(auVar66);
      }
      else {
        local_28e0 = auVar93;
        local_2960 = ZEXT1632(auVar13);
        local_2940 = auVar77;
        auVar191 = local_2940;
        local_2b40 = auVar63;
        auVar97 = vandps_avx(auVar97,auVar66);
        auVar30._4_4_ = auVar109._4_4_ * auVar153._4_4_;
        auVar30._0_4_ = auVar109._0_4_ * auVar153._0_4_;
        auVar30._8_4_ = auVar109._8_4_ * auVar153._8_4_;
        auVar30._12_4_ = auVar109._12_4_ * auVar153._12_4_;
        auVar30._16_4_ = auVar109._16_4_ * 0.0;
        auVar30._20_4_ = auVar109._20_4_ * 0.0;
        auVar30._24_4_ = auVar109._24_4_ * 0.0;
        auVar30._28_4_ = auVar82._28_4_;
        auVar8 = vfmadd213ps_fma(local_2b20,ZEXT1632(auVar139),auVar30);
        auVar95 = (undefined1  [36])0x0;
        auVar8 = vfmadd213ps_fma(local_2be0,ZEXT1632(auVar123),ZEXT1632(auVar8));
        auVar172._0_4_ = (float)(uVar50 ^ auVar8._0_4_);
        auVar172._4_4_ = (float)(uVar205 ^ auVar8._4_4_);
        auVar172._8_4_ = (float)(uVar207 ^ auVar8._8_4_);
        auVar172._12_4_ = (float)(uVar218 ^ auVar8._12_4_);
        auVar172._16_4_ = fVar209;
        auVar172._20_4_ = fVar211;
        auVar172._24_4_ = fVar213;
        auVar172._28_4_ = uVar54;
        auVar174 = ZEXT3264(auVar172);
        auVar98 = vcmpps_avx(auVar172,_DAT_02020f00,5);
        auVar110 = auVar97 & auVar98;
        if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0x7f,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar110 >> 0xbf,0) == '\0') &&
            (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar110[0x1f]) {
          auVar233 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar74 = vpcmpeqd_avx2(auVar98,auVar98);
          auVar104 = ZEXT3264(auVar74);
          auVar94 = ZEXT3264(auVar66);
        }
        else {
          local_2be0 = auVar76;
          auVar110 = vandps_avx(ZEXT1632(auVar89),local_2920);
          auVar95 = ZEXT436(auVar110._28_4_);
          auVar103 = vandps_avx(auVar97,auVar98);
          auVar97 = vsubps_avx(auVar110,auVar225);
          auVar97 = vcmpps_avx(auVar97,auVar172,5);
          auVar98 = auVar103 & auVar97;
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar98 >> 0x7f,0) == '\0') &&
                (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0xbf,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar98[0x1f]) {
LAB_005ba19e:
            auVar74 = vpcmpeqd_avx2(auVar103,auVar103);
          }
          else {
            auVar103 = vandps_avx(auVar97,auVar103);
            auVar32._4_4_ = auVar9._4_4_ * auVar13._4_4_;
            auVar32._0_4_ = auVar9._0_4_ * auVar13._0_4_;
            auVar32._8_4_ = auVar9._8_4_ * auVar13._8_4_;
            auVar32._12_4_ = auVar9._12_4_ * auVar13._12_4_;
            auVar32._16_4_ = auVar9._16_4_ * 0.0;
            auVar32._20_4_ = auVar9._20_4_ * 0.0;
            auVar32._24_4_ = auVar9._24_4_ * 0.0;
            auVar32._28_4_ = auVar97._28_4_;
            auVar8 = vfmadd132ps_fma(auVar70,auVar32,auVar77);
            auVar183 = ZEXT1664(auVar8);
            auVar153 = vfmadd132ps_fma(auVar93,ZEXT1632(auVar8),auVar63);
            auVar139._0_4_ = (float)(uVar50 ^ auVar153._0_4_);
            auVar139._4_4_ = (float)(uVar205 ^ auVar153._4_4_);
            auVar139._8_4_ = (float)(uVar207 ^ auVar153._8_4_);
            auVar139._12_4_ = (float)(uVar218 ^ auVar153._12_4_);
            auVar144._16_4_ = fVar209;
            auVar144._0_16_ = auVar139;
            auVar144._20_4_ = fVar211;
            auVar144._24_4_ = fVar213;
            auVar144._28_4_ = uVar54;
            auVar145 = ZEXT3264(auVar144);
            auVar67._0_4_ = auVar110._0_4_ * *(float *)(ray + 0x60);
            auVar67._4_4_ = auVar110._4_4_ * *(float *)(ray + 100);
            auVar67._8_4_ = auVar110._8_4_ * *(float *)(ray + 0x68);
            auVar67._12_4_ = auVar110._12_4_ * *(float *)(ray + 0x6c);
            auVar67._16_4_ = auVar110._16_4_ * *(float *)(ray + 0x70);
            auVar67._20_4_ = auVar110._20_4_ * *(float *)(ray + 0x74);
            auVar67._24_4_ = auVar110._24_4_ * *(float *)(ray + 0x78);
            auVar67._28_4_ = 0;
            auVar97 = vcmpps_avx(auVar67,auVar144,1);
            local_2b20 = *(undefined1 (*) [32])(ray + 0x100);
            auVar33._4_4_ = auVar110._4_4_ * *(float *)(ray + 0x104);
            auVar33._0_4_ = auVar110._0_4_ * *(float *)(ray + 0x100);
            auVar33._8_4_ = auVar110._8_4_ * *(float *)(ray + 0x108);
            auVar33._12_4_ = auVar110._12_4_ * *(float *)(ray + 0x10c);
            auVar33._16_4_ = auVar110._16_4_ * *(float *)(ray + 0x110);
            auVar33._20_4_ = auVar110._20_4_ * *(float *)(ray + 0x114);
            auVar33._24_4_ = auVar110._24_4_ * *(float *)(ray + 0x118);
            auVar33._28_4_ = *(undefined4 *)(ray + 0x11c);
            auVar98 = vcmpps_avx(auVar144,auVar33,2);
            auVar97 = vandps_avx(auVar98,auVar97);
            auVar161 = ZEXT3264(auVar97);
            auVar192 = auVar103 & auVar97;
            if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar192 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar192 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar192 >> 0x7f,0) == '\0') &&
                  (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar192 >> 0xbf,0) == '\0') &&
                (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar192[0x1f]) goto LAB_005ba19e;
            auVar103 = vandps_avx(auVar97,auVar103);
            auVar97 = vcmpps_avx(ZEXT1632(auVar89),_DAT_02020f00,4);
            auVar115 = ZEXT3264(auVar97);
            auVar192 = auVar103 & auVar97;
            if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar192 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar192 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar192 >> 0x7f,0) == '\0') &&
                  (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar192 >> 0xbf,0) == '\0') &&
                (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar192[0x1f]) goto LAB_005ba19e;
            auVar103 = vandps_avx(auVar97,auVar103);
            uVar50 = pGVar3->mask;
            auVar68._4_4_ = uVar50;
            auVar68._0_4_ = uVar50;
            auVar68._8_4_ = uVar50;
            auVar68._12_4_ = uVar50;
            auVar68._16_4_ = uVar50;
            auVar68._20_4_ = uVar50;
            auVar68._24_4_ = uVar50;
            auVar68._28_4_ = uVar50;
            auVar97 = vpand_avx2(auVar68,*(undefined1 (*) [32])(ray + 0x120));
            auVar192 = vpcmpeqd_avx2(auVar97,_DAT_02020f00);
            auVar115 = ZEXT3264(auVar192);
            auVar97 = auVar103 & ~auVar192;
            if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar97 >> 0x7f,0) == '\0') &&
                  (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0xbf,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar97[0x1f]) goto LAB_005ba19e;
            auVar66 = vandnps_avx(auVar192,auVar103);
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (auVar95 = ZEXT436(auVar110._28_4_),
               pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              auVar97 = vrcpps_avx(auVar110);
              auVar160._8_4_ = 0x3f800000;
              auVar160._0_8_ = &DAT_3f8000003f800000;
              auVar160._12_4_ = 0x3f800000;
              auVar160._16_4_ = 0x3f800000;
              auVar160._20_4_ = 0x3f800000;
              auVar160._24_4_ = 0x3f800000;
              auVar160._28_4_ = 0x3f800000;
              auVar89 = vfnmadd213ps_fma(auVar110,auVar97,auVar160);
              auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar97,auVar97);
              auVar95 = (undefined1  [36])0x0;
              fVar96 = auVar89._0_4_;
              fVar105 = auVar89._4_4_;
              auVar37._4_4_ = auVar224._4_4_ * fVar105;
              auVar37._0_4_ = auVar224._0_4_ * fVar96;
              fVar106 = auVar89._8_4_;
              auVar37._8_4_ = auVar224._8_4_ * fVar106;
              fVar107 = auVar89._12_4_;
              auVar37._12_4_ = auVar224._12_4_ * fVar107;
              auVar37._16_4_ = fVar209 * 0.0;
              auVar37._20_4_ = fVar211 * 0.0;
              auVar37._24_4_ = fVar213 * 0.0;
              auVar37._28_4_ = auVar97._28_4_;
              auVar97 = vminps_avx(auVar37,auVar160);
              auVar38._4_4_ = auVar172._4_4_ * fVar105;
              auVar38._0_4_ = auVar172._0_4_ * fVar96;
              auVar38._8_4_ = auVar172._8_4_ * fVar106;
              auVar38._12_4_ = auVar172._12_4_ * fVar107;
              auVar38._16_4_ = fVar209 * 0.0;
              auVar38._20_4_ = fVar211 * 0.0;
              auVar38._24_4_ = fVar213 * 0.0;
              auVar38._28_4_ = auVar98._28_4_;
              auVar98 = vminps_avx(auVar38,auVar160);
              auVar110 = vsubps_avx(auVar160,auVar97);
              auVar192 = vsubps_avx(auVar160,auVar98);
              auVar174 = ZEXT3264(local_28a0);
              local_2a60 = vblendvps_avx(auVar97,auVar110,local_28a0);
              local_2a40 = vblendvps_avx(auVar98,auVar192,local_28a0);
              pRVar6 = context->user;
              auVar89._4_4_ = uVar201;
              auVar89._0_4_ = uVar201;
              auVar89._8_4_ = uVar201;
              auVar89._12_4_ = uVar201;
              auVar103._16_4_ = uVar201;
              auVar103._0_16_ = auVar89;
              auVar103._20_4_ = uVar201;
              auVar103._24_4_ = uVar201;
              auVar103._28_4_ = uVar201;
              auVar153._4_4_ = iVar51;
              auVar153._0_4_ = iVar51;
              auVar153._8_4_ = iVar51;
              auVar153._12_4_ = iVar51;
              local_2a20._16_4_ = iVar51;
              local_2a20._0_16_ = auVar153;
              local_2a20._20_4_ = iVar51;
              local_2a20._24_4_ = iVar51;
              local_2a20._28_4_ = iVar51;
              auVar161 = ZEXT3264(local_2a20);
              _local_2ac0 = ZEXT1632(auVar11);
              local_2940._0_8_ = auVar12._0_8_;
              local_2940._8_8_ = auVar12._8_8_;
              local_2aa0 = local_2940._0_8_;
              uStack_2a98 = local_2940._8_8_;
              uStack_2a90 = 0;
              uStack_2a88 = 0;
              auVar131 = ZEXT3264(local_2960);
              _local_2a80 = local_2960;
              local_2a00 = auVar103;
              auVar97 = vpcmpeqd_avx2(local_2a60,local_2a60);
              local_2940 = auVar191;
              local_2bf0[1] = auVar97;
              *local_2bf0 = auVar97;
              local_29e0 = pRVar6->instID[0];
              uStack_29dc = local_29e0;
              uStack_29d8 = local_29e0;
              uStack_29d4 = local_29e0;
              uStack_29d0 = local_29e0;
              uStack_29cc = local_29e0;
              uStack_29c8 = local_29e0;
              uStack_29c4 = local_29e0;
              local_29c0 = pRVar6->instPrimID[0];
              auVar39._4_4_ = fVar105 * auVar139._4_4_;
              auVar39._0_4_ = fVar96 * auVar139._0_4_;
              auVar39._8_4_ = fVar106 * auVar139._8_4_;
              auVar39._12_4_ = fVar107 * auVar139._12_4_;
              auVar39._16_4_ = fVar209 * 0.0;
              auVar39._20_4_ = fVar211 * 0.0;
              auVar39._24_4_ = fVar213 * 0.0;
              auVar39._28_4_ = local_2a40._28_4_;
              uStack_29bc = local_29c0;
              uStack_29b8 = local_29c0;
              uStack_29b4 = local_29c0;
              uStack_29b0 = local_29c0;
              uStack_29ac = local_29c0;
              uStack_29a8 = local_29c0;
              uStack_29a4 = local_29c0;
              auVar97 = vblendvps_avx(local_2b20,auVar39,auVar66);
              *(undefined1 (*) [32])(ray + 0x100) = auVar97;
              local_2c80 = auVar66;
              local_2c60 = (undefined1  [8])local_2c80;
              uStack_2c58 = pGVar3->userPtr;
              uStack_2c50 = context->user;
              pRStack_2c48 = ray;
              local_2c40 = (RTCHitN *)local_2ac0;
              fStack_2c38 = 1.12104e-44;
              local_2b40 = ZEXT1632(CONCAT88(auVar11._8_8_,pGVar3));
              if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar95 = (undefined1  [36])0x0;
                auVar103 = ZEXT1632(auVar89);
                auVar131 = ZEXT1664(auVar13);
                auVar145 = ZEXT1664(auVar139);
                auVar161 = ZEXT1664(auVar153);
                auVar174 = ZEXT1664(auVar62._0_16_);
                auVar183 = ZEXT1664(auVar8);
                auVar194 = ZEXT1664(auVar9._0_16_);
                auVar203 = ZEXT1664(auVar109._0_16_);
                in_ZMM12 = ZEXT1664(auVar74._0_16_);
                in_ZMM13 = ZEXT1664(auVar224);
                auVar241 = ZEXT1664(auVar123);
                (*pGVar3->occlusionFilterN)((RTCFilterFunctionNArguments *)local_2c60);
              }
              auVar66 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2c80);
              auVar74 = _DAT_0205a980 & ~auVar66;
              if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar74 >> 0x7f,0) == '\0') &&
                    (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar74 >> 0xbf,0) == '\0') &&
                  (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar74[0x1f]) {
                auVar66 = auVar66 ^ _DAT_0205a980;
              }
              else {
                p_Var7 = context->args->filter;
                if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                    ((*(byte *)(local_2b40._0_8_ + 0x3e) & 0x40) != 0)))) {
                  auVar95 = (undefined1  [36])0x0;
                  auVar103 = ZEXT1632(auVar103._0_16_);
                  auVar131 = ZEXT1664(auVar131._0_16_);
                  auVar145 = ZEXT1664(auVar145._0_16_);
                  auVar161 = ZEXT1664(auVar161._0_16_);
                  auVar174 = ZEXT1664(auVar174._0_16_);
                  auVar183 = ZEXT1664(auVar183._0_16_);
                  auVar194 = ZEXT1664(auVar194._0_16_);
                  auVar203 = ZEXT1664(auVar203._0_16_);
                  in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                  auVar241 = ZEXT1664(auVar241._0_16_);
                  (*p_Var7)((RTCFilterFunctionNArguments *)local_2c60);
                }
                auVar74 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),local_2c80);
                auVar66 = auVar74 ^ _DAT_0205a980;
                auVar79._8_4_ = 0xff800000;
                auVar79._0_8_ = 0xff800000ff800000;
                auVar79._12_4_ = 0xff800000;
                auVar79._16_4_ = 0xff800000;
                auVar79._20_4_ = 0xff800000;
                auVar79._24_4_ = 0xff800000;
                auVar79._28_4_ = 0xff800000;
                auVar74 = vblendvps_avx(auVar79,*(undefined1 (*) [32])(pRStack_2c48 + 0x100),auVar74
                                       );
                *(undefined1 (*) [32])(pRStack_2c48 + 0x100) = auVar74;
              }
              auVar74 = vblendvps_avx(local_2b20,*(undefined1 (*) [32])local_2ca8,auVar66);
              *(undefined1 (*) [32])local_2ca8 = auVar74;
            }
            auVar115 = ZEXT3264(auVar66);
            auVar66 = vandnps_avx(auVar66,local_2ce0._0_32_);
            auVar74 = vpcmpeqd_avx2(auVar103,auVar103);
          }
          auVar233 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar104 = ZEXT3264(auVar74);
          auVar94 = ZEXT3264(auVar66);
          auVar76 = local_2be0;
        }
      }
      auVar66 = auVar94._0_32_;
      if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar66 >> 0x7f,0) == '\0') &&
            (auVar94 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar66 >> 0xbf,0) == '\0') &&
          (auVar94 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) && -1 < auVar94[0x1f])
      {
        bVar61 = false;
        auVar82 = auVar94;
      }
      else {
        auVar109 = vsubps_avx(_local_2bc0,_local_2980);
        auVar110 = vsubps_avx(_local_2ae0,_local_29a0);
        auVar161 = ZEXT3264(auVar110);
        auVar191 = vsubps_avx(_local_2b00,local_2860);
        auVar194 = ZEXT3264(auVar191);
        local_2be0 = auVar76;
        auVar192 = vsubps_avx(local_2d00,_local_2bc0);
        auVar93 = vsubps_avx(local_2ca0,_local_2ae0);
        auVar70 = vsubps_avx(_local_2b80,_local_2b00);
        auVar183._0_4_ = auVar70._0_4_ * auVar110._0_4_;
        auVar183._4_4_ = auVar70._4_4_ * auVar110._4_4_;
        auVar183._8_4_ = auVar70._8_4_ * auVar110._8_4_;
        auVar183._12_4_ = auVar70._12_4_ * auVar110._12_4_;
        auVar183._16_4_ = auVar70._16_4_ * auVar110._16_4_;
        auVar183._20_4_ = auVar70._20_4_ * auVar110._20_4_;
        auVar183._24_4_ = auVar70._24_4_ * auVar110._24_4_;
        auVar183._28_36_ = auVar95;
        auVar11 = vfmsub231ps_fma(auVar183._0_32_,auVar93,auVar191);
        auVar24._4_4_ = auVar191._4_4_ * auVar192._4_4_;
        auVar24._0_4_ = auVar191._0_4_ * auVar192._0_4_;
        auVar24._8_4_ = auVar191._8_4_ * auVar192._8_4_;
        auVar24._12_4_ = auVar191._12_4_ * auVar192._12_4_;
        auVar24._16_4_ = auVar191._16_4_ * auVar192._16_4_;
        auVar24._20_4_ = auVar191._20_4_ * auVar192._20_4_;
        auVar24._24_4_ = auVar191._24_4_ * auVar192._24_4_;
        auVar24._28_4_ = local_2b80._28_4_;
        auVar12 = vfmsub231ps_fma(auVar24,auVar70,auVar109);
        auVar25._4_4_ = auVar93._4_4_ * auVar109._4_4_;
        auVar25._0_4_ = auVar93._0_4_ * auVar109._0_4_;
        auVar25._8_4_ = auVar93._8_4_ * auVar109._8_4_;
        auVar25._12_4_ = auVar93._12_4_ * auVar109._12_4_;
        auVar25._16_4_ = auVar93._16_4_ * auVar109._16_4_;
        auVar25._20_4_ = auVar93._20_4_ * auVar109._20_4_;
        auVar25._24_4_ = auVar93._24_4_ * auVar109._24_4_;
        auVar25._28_4_ = auVar109._28_4_;
        auVar9 = vsubps_avx(_local_2bc0,*(undefined1 (*) [32])ray);
        auVar131 = ZEXT3264(auVar9);
        auVar62 = vsubps_avx(_local_2ae0,*(undefined1 (*) [32])(ray + 0x20));
        auVar145 = ZEXT3264(auVar62);
        auVar63 = vsubps_avx(_local_2b00,*(undefined1 (*) [32])(ray + 0x40));
        auVar183 = ZEXT3264(auVar63);
        auVar13 = vfmsub231ps_fma(auVar25,auVar192,auVar110);
        auVar74 = *(undefined1 (*) [32])(ray + 0x80);
        auVar97 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar203._0_4_ = auVar74._0_4_ * auVar62._0_4_;
        auVar203._4_4_ = auVar74._4_4_ * auVar62._4_4_;
        auVar203._8_4_ = auVar74._8_4_ * auVar62._8_4_;
        auVar203._12_4_ = auVar74._12_4_ * auVar62._12_4_;
        auVar203._16_4_ = auVar74._16_4_ * auVar62._16_4_;
        auVar203._20_4_ = auVar74._20_4_ * auVar62._20_4_;
        auVar203._28_36_ = in_ZMM13._28_36_;
        auVar203._24_4_ = auVar74._24_4_ * auVar62._24_4_;
        auVar153 = vfmsub231ps_fma(auVar203._0_32_,auVar9,auVar97);
        in_ZMM13 = ZEXT1664(auVar153);
        auVar98 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar26._4_4_ = auVar98._4_4_ * auVar13._4_4_;
        auVar26._0_4_ = auVar98._0_4_ * auVar13._0_4_;
        auVar26._8_4_ = auVar98._8_4_ * auVar13._8_4_;
        auVar26._12_4_ = auVar98._12_4_ * auVar13._12_4_;
        auVar26._16_4_ = auVar98._16_4_ * 0.0;
        auVar26._20_4_ = auVar98._20_4_ * 0.0;
        auVar26._24_4_ = auVar98._24_4_ * 0.0;
        auVar26._28_4_ = local_2b00._28_4_;
        auVar77 = ZEXT1632(auVar12);
        auVar89 = vfmadd231ps_fma(auVar26,auVar77,auVar97);
        auVar27._4_4_ = auVar97._4_4_ * auVar63._4_4_;
        auVar27._0_4_ = auVar97._0_4_ * auVar63._0_4_;
        auVar27._8_4_ = auVar97._8_4_ * auVar63._8_4_;
        auVar27._12_4_ = auVar97._12_4_ * auVar63._12_4_;
        auVar27._16_4_ = auVar97._16_4_ * auVar63._16_4_;
        auVar27._20_4_ = auVar97._20_4_ * auVar63._20_4_;
        auVar27._24_4_ = auVar97._24_4_ * auVar63._24_4_;
        auVar27._28_4_ = auVar97._28_4_;
        auVar123 = vfmsub231ps_fma(auVar27,auVar62,auVar98);
        auVar28._4_4_ = auVar98._4_4_ * auVar9._4_4_;
        auVar28._0_4_ = auVar98._0_4_ * auVar9._0_4_;
        auVar28._8_4_ = auVar98._8_4_ * auVar9._8_4_;
        auVar28._12_4_ = auVar98._12_4_ * auVar9._12_4_;
        auVar28._16_4_ = auVar98._16_4_ * auVar9._16_4_;
        auVar28._20_4_ = auVar98._20_4_ * auVar9._20_4_;
        auVar28._24_4_ = auVar98._24_4_ * auVar9._24_4_;
        auVar28._28_4_ = auVar98._28_4_;
        auVar139 = vfmsub231ps_fma(auVar28,auVar63,auVar74);
        auVar241 = ZEXT1664(auVar139);
        auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),ZEXT1632(auVar11),auVar74);
        auVar174 = ZEXT1664(auVar89);
        auVar29._4_4_ = auVar70._4_4_ * auVar153._4_4_;
        auVar29._0_4_ = auVar70._0_4_ * auVar153._0_4_;
        auVar29._8_4_ = auVar70._8_4_ * auVar153._8_4_;
        auVar29._12_4_ = auVar70._12_4_ * auVar153._12_4_;
        auVar29._16_4_ = auVar70._16_4_ * 0.0;
        auVar29._20_4_ = auVar70._20_4_ * 0.0;
        auVar29._24_4_ = auVar70._24_4_ * 0.0;
        auVar29._28_4_ = auVar74._28_4_;
        auVar8 = vfmadd231ps_fma(auVar29,ZEXT1632(auVar139),auVar93);
        auVar74 = vandps_avx(ZEXT1632(auVar89),auVar76);
        auVar203 = ZEXT3264(auVar74);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar123),auVar192);
        uVar201 = auVar74._0_4_;
        auVar114._0_4_ = (float)(uVar201 ^ auVar8._0_4_);
        uVar50 = auVar74._4_4_;
        auVar114._4_4_ = (float)(uVar50 ^ auVar8._4_4_);
        uVar205 = auVar74._8_4_;
        auVar114._8_4_ = (float)(uVar205 ^ auVar8._8_4_);
        uVar207 = auVar74._12_4_;
        auVar114._12_4_ = (float)(uVar207 ^ auVar8._12_4_);
        fVar209 = auVar74._16_4_;
        auVar114._16_4_ = fVar209;
        fVar211 = auVar74._20_4_;
        auVar114._20_4_ = fVar211;
        fVar213 = auVar74._24_4_;
        auVar114._24_4_ = fVar213;
        uVar54 = auVar74._28_4_;
        auVar114._28_4_ = uVar54;
        auVar115 = ZEXT3264(auVar114);
        auVar82 = ZEXT3264(auVar66);
        auVar97 = vcmpps_avx(auVar114,_DAT_02020f00,5);
        in_ZMM12 = ZEXT3264(auVar97);
        auVar98 = auVar66 & auVar97;
        auVar192 = ZEXT1632(auVar13);
        local_2d00 = auVar109;
        local_2ce0._0_32_ = auVar66;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0x7f,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0xbf,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar98[0x1f]) {
          auVar233 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar66 = vpcmpeqd_avx2(auVar192,auVar192);
          auVar104 = ZEXT3264(auVar66);
        }
        else {
          _local_2b80 = ZEXT1632(auVar13);
          auVar97 = vandps_avx(auVar97,auVar66);
          in_ZMM12 = ZEXT3264(auVar97);
          auVar31._4_4_ = auVar191._4_4_ * auVar153._4_4_;
          auVar31._0_4_ = auVar191._0_4_ * auVar153._0_4_;
          auVar31._8_4_ = auVar191._8_4_ * auVar153._8_4_;
          auVar31._12_4_ = auVar191._12_4_ * auVar153._12_4_;
          auVar31._16_4_ = auVar191._16_4_ * 0.0;
          auVar31._20_4_ = auVar191._20_4_ * 0.0;
          auVar31._24_4_ = auVar191._24_4_ * 0.0;
          auVar31._28_4_ = auVar94._28_4_;
          auVar8 = vfmadd213ps_fma(auVar110,ZEXT1632(auVar139),auVar31);
          auVar8 = vfmadd213ps_fma(auVar109,ZEXT1632(auVar123),ZEXT1632(auVar8));
          auVar159._0_4_ = (float)(uVar201 ^ auVar8._0_4_);
          auVar159._4_4_ = (float)(uVar50 ^ auVar8._4_4_);
          auVar159._8_4_ = (float)(uVar205 ^ auVar8._8_4_);
          auVar159._12_4_ = (float)(uVar207 ^ auVar8._12_4_);
          auVar159._16_4_ = fVar209;
          auVar159._20_4_ = fVar211;
          auVar159._24_4_ = fVar213;
          auVar159._28_4_ = uVar54;
          auVar161 = ZEXT3264(auVar159);
          auVar98 = vcmpps_avx(auVar159,_DAT_02020f00,5);
          auVar194 = ZEXT3264(auVar98);
          auVar110 = auVar97 & auVar98;
          if ((((((((auVar110 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar110 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar110 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar110 >> 0x7f,0) == '\0') &&
                (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar110 >> 0xbf,0) == '\0') &&
              (auVar110 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar110[0x1f]) {
            auVar74 = vpcmpeqd_avx2(auVar192,auVar192);
          }
          else {
            auVar110 = vandps_avx(ZEXT1632(auVar89),local_2920);
            auVar97 = vandps_avx(auVar98,auVar97);
            auVar194 = ZEXT3264(auVar97);
            auVar191 = vsubps_avx(auVar110,auVar114);
            auVar98 = vcmpps_avx(auVar191,auVar159,5);
            in_ZMM12 = ZEXT3264(auVar98);
            auVar192 = auVar97 & auVar98;
            if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar192 >> 0x7f,0) != '\0') ||
                  (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar192 >> 0xbf,0) != '\0') ||
                (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar192[0x1f] < '\0') {
              auVar97 = vandps_avx(auVar98,auVar97);
              auVar194 = ZEXT3264(auVar97);
              auVar34._4_4_ = auVar63._4_4_ * auVar13._4_4_;
              auVar34._0_4_ = auVar63._0_4_ * auVar13._0_4_;
              auVar34._8_4_ = auVar63._8_4_ * auVar13._8_4_;
              auVar34._12_4_ = auVar63._12_4_ * auVar13._12_4_;
              auVar34._16_4_ = auVar63._16_4_ * 0.0;
              auVar34._20_4_ = auVar63._20_4_ * 0.0;
              auVar34._24_4_ = auVar63._24_4_ * 0.0;
              auVar34._28_4_ = auVar191._28_4_;
              auVar8 = vfmadd132ps_fma(auVar62,auVar34,auVar77);
              auVar8 = vfmadd213ps_fma(auVar9,ZEXT1632(auVar11),ZEXT1632(auVar8));
              auVar123._0_4_ = (float)(uVar201 ^ auVar8._0_4_);
              auVar123._4_4_ = (float)(uVar50 ^ auVar8._4_4_);
              auVar123._8_4_ = (float)(uVar205 ^ auVar8._8_4_);
              auVar123._12_4_ = (float)(uVar207 ^ auVar8._12_4_);
              auVar130._16_4_ = fVar209;
              auVar130._0_16_ = auVar123;
              auVar130._20_4_ = fVar211;
              auVar130._24_4_ = fVar213;
              auVar130._28_4_ = uVar54;
              auVar131 = ZEXT3264(auVar130);
              auVar35._4_4_ = auVar110._4_4_ * *(float *)(ray + 100);
              auVar35._0_4_ = auVar110._0_4_ * *(float *)(ray + 0x60);
              auVar35._8_4_ = auVar110._8_4_ * *(float *)(ray + 0x68);
              auVar35._12_4_ = auVar110._12_4_ * *(float *)(ray + 0x6c);
              auVar35._16_4_ = auVar110._16_4_ * *(float *)(ray + 0x70);
              auVar35._20_4_ = auVar110._20_4_ * *(float *)(ray + 0x74);
              auVar35._24_4_ = auVar110._24_4_ * *(float *)(ray + 0x78);
              auVar35._28_4_ = auVar191._28_4_;
              auVar191 = vcmpps_avx(auVar35,auVar130,1);
              _local_2bc0 = *(undefined1 (*) [32])(ray + 0x100);
              auVar36._4_4_ = auVar110._4_4_ * *(float *)(ray + 0x104);
              auVar36._0_4_ = auVar110._0_4_ * *(float *)(ray + 0x100);
              auVar36._8_4_ = auVar110._8_4_ * *(float *)(ray + 0x108);
              auVar36._12_4_ = auVar110._12_4_ * *(float *)(ray + 0x10c);
              auVar36._16_4_ = auVar110._16_4_ * *(float *)(ray + 0x110);
              auVar36._20_4_ = auVar110._20_4_ * *(float *)(ray + 0x114);
              auVar36._24_4_ = auVar110._24_4_ * *(float *)(ray + 0x118);
              auVar36._28_4_ = *(undefined4 *)(ray + 0x11c);
              auVar192 = vcmpps_avx(auVar130,auVar36,2);
              auVar191 = vandps_avx(auVar192,auVar191);
              auVar145 = ZEXT3264(auVar191);
              auVar192 = auVar97 & auVar191;
              if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar192 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar192 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar192 >> 0x7f,0) != '\0') ||
                    (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar192 >> 0xbf,0) != '\0') ||
                  (auVar192 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar192[0x1f] < '\0') {
                auVar191 = vandps_avx(auVar97,auVar191);
                auVar145 = ZEXT3264(auVar191);
                auVar192 = vcmpps_avx(ZEXT1632(auVar89),_DAT_02020f00,4);
                auVar174 = ZEXT3264(auVar192);
                auVar93 = auVar191 & auVar192;
                if ((((((((auVar93 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar93 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar93 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar93 >> 0x7f,0) != '\0') ||
                      (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar93 >> 0xbf,0) != '\0') ||
                    (auVar93 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar93[0x1f] < '\0') {
                  auVar191 = vandps_avx(auVar192,auVar191);
                  auVar145 = ZEXT3264(auVar191);
                  uVar50 = *(uint *)(puVar55 + uVar52 * 4 + 0x40);
                  local_2d00._0_8_ = (context->scene->geometries).items[uVar50].ptr;
                  local_2d00._8_24_ = auVar109._8_24_;
                  uVar201 = ((Geometry *)local_2d00._0_8_)->mask;
                  auVar69._4_4_ = uVar201;
                  auVar69._0_4_ = uVar201;
                  auVar69._8_4_ = uVar201;
                  auVar69._12_4_ = uVar201;
                  auVar69._16_4_ = uVar201;
                  auVar69._20_4_ = uVar201;
                  auVar69._24_4_ = uVar201;
                  auVar69._28_4_ = uVar201;
                  auVar109 = vpand_avx2(auVar69,*(undefined1 (*) [32])(ray + 0x120));
                  auVar192 = vpcmpeqd_avx2(auVar109,_DAT_02020f00);
                  auVar174 = ZEXT3264(auVar192);
                  auVar109 = auVar191 & ~auVar192;
                  if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar109 >> 0x7f,0) != '\0') ||
                        (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar109 >> 0xbf,0) != '\0') ||
                      (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar109[0x1f] < '\0') {
                    uVar2 = *(undefined4 *)(puVar55 + uVar52 * 4 + 0x50);
                    auVar66 = vandnps_avx(auVar192,auVar191);
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (((Geometry *)local_2d00._0_8_)->occlusionFilterN != (RTCFilterFunctionN)0x0)
                       ) {
                      auVar109 = vrcpps_avx(auVar110);
                      auVar173._8_4_ = 0x3f800000;
                      auVar173._0_8_ = &DAT_3f8000003f800000;
                      auVar173._12_4_ = 0x3f800000;
                      auVar173._16_4_ = 0x3f800000;
                      auVar173._20_4_ = 0x3f800000;
                      auVar173._24_4_ = 0x3f800000;
                      auVar173._28_4_ = 0x3f800000;
                      auVar89 = vfnmadd213ps_fma(auVar110,auVar109,auVar173);
                      auVar89 = vfmadd132ps_fma(ZEXT1632(auVar89),auVar109,auVar109);
                      auVar110 = ZEXT1632(auVar89);
                      fVar96 = auVar89._0_4_;
                      fVar105 = auVar89._4_4_;
                      auVar40._4_4_ = fVar105 * auVar114._4_4_;
                      auVar40._0_4_ = fVar96 * auVar114._0_4_;
                      fVar106 = auVar89._8_4_;
                      auVar40._8_4_ = fVar106 * auVar114._8_4_;
                      fVar107 = auVar89._12_4_;
                      auVar40._12_4_ = fVar107 * auVar114._12_4_;
                      auVar40._16_4_ = fVar209 * 0.0;
                      auVar40._20_4_ = fVar211 * 0.0;
                      auVar40._24_4_ = fVar213 * 0.0;
                      auVar40._28_4_ = auVar109._28_4_;
                      auVar109 = vminps_avx(auVar40,auVar173);
                      auVar41._4_4_ = fVar105 * auVar159._4_4_;
                      auVar41._0_4_ = fVar96 * auVar159._0_4_;
                      auVar41._8_4_ = fVar106 * auVar159._8_4_;
                      auVar41._12_4_ = fVar107 * auVar159._12_4_;
                      auVar41._16_4_ = fVar209 * 0.0;
                      auVar41._20_4_ = fVar211 * 0.0;
                      auVar41._24_4_ = fVar213 * 0.0;
                      auVar41._28_4_ = uVar54;
                      auVar191 = vminps_avx(auVar41,auVar173);
                      auVar192 = vsubps_avx(auVar173,auVar109);
                      auVar93 = vsubps_avx(auVar173,auVar191);
                      auVar8._8_8_ = uStack_28b8;
                      auVar8._0_8_ = local_28c0;
                      auVar46._16_8_ = uStack_28b0;
                      auVar46._0_16_ = auVar8;
                      auVar46._24_8_ = uStack_28a8;
                      auVar183 = ZEXT3264(auVar46);
                      local_2a60 = vblendvps_avx(auVar109,auVar192,auVar46);
                      local_2a40 = vblendvps_avx(auVar191,auVar93,auVar46);
                      auVar115 = ZEXT3264(local_2a40);
                      pRVar6 = context->user;
                      auVar154._4_4_ = uVar50;
                      auVar154._0_4_ = uVar50;
                      auVar154._8_4_ = uVar50;
                      auVar154._12_4_ = uVar50;
                      local_2a00._16_4_ = uVar50;
                      local_2a00._0_16_ = auVar154;
                      local_2a00._20_4_ = uVar50;
                      local_2a00._24_4_ = uVar50;
                      local_2a00._28_4_ = uVar50;
                      auVar161 = ZEXT3264(local_2a00);
                      auVar169._4_4_ = uVar2;
                      auVar169._0_4_ = uVar2;
                      auVar169._8_4_ = uVar2;
                      auVar169._12_4_ = uVar2;
                      local_2a20._16_4_ = uVar2;
                      local_2a20._0_16_ = auVar169;
                      local_2a20._20_4_ = uVar2;
                      local_2a20._24_4_ = uVar2;
                      local_2a20._28_4_ = uVar2;
                      auVar174 = ZEXT3264(local_2a20);
                      _local_2ac0 = ZEXT1632(auVar11);
                      local_2ca0._0_8_ = auVar12._0_8_;
                      local_2ca0._8_8_ = auVar12._8_8_;
                      local_2aa0 = local_2ca0._0_8_;
                      uStack_2a98 = local_2ca0._8_8_;
                      uStack_2a90 = 0;
                      uStack_2a88 = 0;
                      _local_2a80 = ZEXT1632(auVar13);
                      auVar109 = vpcmpeqd_avx2(local_2a60,local_2a60);
                      local_2bf0[1] = auVar109;
                      *local_2bf0 = auVar109;
                      local_29e0 = pRVar6->instID[0];
                      uStack_29dc = local_29e0;
                      uStack_29d8 = local_29e0;
                      uStack_29d4 = local_29e0;
                      uStack_29d0 = local_29e0;
                      uStack_29cc = local_29e0;
                      uStack_29c8 = local_29e0;
                      uStack_29c4 = local_29e0;
                      local_29c0 = pRVar6->instPrimID[0];
                      auVar42._4_4_ = fVar105 * auVar123._4_4_;
                      auVar42._0_4_ = fVar96 * auVar123._0_4_;
                      auVar42._8_4_ = fVar106 * auVar123._8_4_;
                      auVar42._12_4_ = fVar107 * auVar123._12_4_;
                      auVar42._16_4_ = fVar209 * 0.0;
                      auVar42._20_4_ = fVar211 * 0.0;
                      auVar42._24_4_ = fVar213 * 0.0;
                      auVar42._28_4_ = 0;
                      uStack_29bc = local_29c0;
                      uStack_29b8 = local_29c0;
                      uStack_29b4 = local_29c0;
                      uStack_29b0 = local_29c0;
                      uStack_29ac = local_29c0;
                      uStack_29a8 = local_29c0;
                      uStack_29a4 = local_29c0;
                      auVar109 = vblendvps_avx(_local_2bc0,auVar42,auVar66);
                      *(undefined1 (*) [32])(ray + 0x100) = auVar109;
                      local_2c80 = auVar66;
                      local_2c60 = (undefined1  [8])local_2c80;
                      uStack_2c58 = ((Geometry *)local_2d00._0_8_)->userPtr;
                      uStack_2c50 = context->user;
                      pRStack_2c48 = ray;
                      local_2c40 = (RTCHitN *)local_2ac0;
                      fStack_2c38 = 1.12104e-44;
                      local_2ca0 = auVar77;
                      if (((Geometry *)local_2d00._0_8_)->occlusionFilterN !=
                          (RTCFilterFunctionN)0x0) {
                        auVar110 = ZEXT1632(auVar89);
                        auVar115 = ZEXT1664(local_2a40._0_16_);
                        auVar131 = ZEXT1664(auVar123);
                        auVar161 = ZEXT1664(auVar154);
                        auVar174 = ZEXT1664(auVar169);
                        auVar183 = ZEXT1664(auVar8);
                        auVar194 = ZEXT1664(auVar97._0_16_);
                        auVar203 = ZEXT1664(auVar74._0_16_);
                        in_ZMM12 = ZEXT1664(auVar98._0_16_);
                        in_ZMM13 = ZEXT1664(auVar153);
                        auVar241 = ZEXT1664(auVar139);
                        (*((Geometry *)local_2d00._0_8_)->occlusionFilterN)
                                  ((RTCFilterFunctionNArguments *)local_2c60);
                      }
                      auVar66 = vpcmpeqd_avx2(ZEXT1632(ZEXT816(0) << 0x40),local_2c80);
                      auVar74 = _DAT_0205a980 & ~auVar66;
                      if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar74 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar74 >> 0x7f,0) == '\0') &&
                            (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar74 >> 0xbf,0) == '\0') &&
                          (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar74[0x1f]) {
                        auVar66 = auVar66 ^ _DAT_0205a980;
                      }
                      else {
                        p_Var7 = context->args->filter;
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            ((*(byte *)(local_2d00._0_8_ + 0x3e) & 0x40) != 0)))) {
                          auVar110 = ZEXT1632(auVar110._0_16_);
                          auVar115 = ZEXT1664(auVar115._0_16_);
                          auVar131 = ZEXT1664(auVar131._0_16_);
                          auVar161 = ZEXT1664(auVar161._0_16_);
                          auVar174 = ZEXT1664(auVar174._0_16_);
                          auVar183 = ZEXT1664(auVar183._0_16_);
                          auVar194 = ZEXT1664(auVar194._0_16_);
                          auVar203 = ZEXT1664(auVar203._0_16_);
                          in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
                          in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                          auVar241 = ZEXT1664(auVar241._0_16_);
                          (*p_Var7)((RTCFilterFunctionNArguments *)local_2c60);
                        }
                        auVar74 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                local_2c80);
                        auVar66 = auVar74 ^ _DAT_0205a980;
                        auVar80._8_4_ = 0xff800000;
                        auVar80._0_8_ = 0xff800000ff800000;
                        auVar80._12_4_ = 0xff800000;
                        auVar80._16_4_ = 0xff800000;
                        auVar80._20_4_ = 0xff800000;
                        auVar80._24_4_ = 0xff800000;
                        auVar80._28_4_ = 0xff800000;
                        auVar74 = vblendvps_avx(auVar80,*(undefined1 (*) [32])(pRStack_2c48 + 0x100)
                                                ,auVar74);
                        *(undefined1 (*) [32])(pRStack_2c48 + 0x100) = auVar74;
                      }
                      auVar74 = vblendvps_avx(_local_2bc0,*(undefined1 (*) [32])local_2ca8,auVar66);
                      *(undefined1 (*) [32])local_2ca8 = auVar74;
                    }
                    auVar145 = ZEXT3264(auVar66);
                    auVar66 = vandnps_avx(auVar66,local_2ce0._0_32_);
                    auVar82 = ZEXT3264(auVar66);
                    auVar233 = ZEXT3264(CONCAT428(0x7f800000,
                                                  CONCAT424(0x7f800000,
                                                            CONCAT420(0x7f800000,
                                                                      CONCAT416(0x7f800000,
                                                                                CONCAT412(0x7f800000
                                                                                          ,CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar66 = vpcmpeqd_avx2(auVar110,auVar110);
                    auVar104 = ZEXT3264(auVar66);
                    goto LAB_005b9c19;
                  }
                }
              }
            }
            auVar74 = vpcmpeqd_avx2(auVar110,auVar110);
          }
          auVar233 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar104 = ZEXT3264(auVar74);
          auVar82 = ZEXT3264(auVar66);
        }
LAB_005b9c19:
        auVar66 = auVar82._0_32_;
        bVar61 = (((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar66 >> 0x7f,0) != '\0') ||
                   (auVar82 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                  SUB321(auVar66 >> 0xbf,0) != '\0') ||
                 (auVar82 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 auVar82[0x1f] < '\0';
      }
      auVar66 = auVar82._0_32_;
      if ((!bVar61) || (bVar61 = 2 < uVar52, uVar52 = uVar52 + 1, bVar61)) break;
    }
    auVar82 = ZEXT3264(local_2900);
    auVar74 = vandps_avx(auVar66,local_2900);
    auVar66 = local_2900 & auVar66;
    if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar66 >> 0x7f,0) == '\0') &&
          (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar66 >> 0xbf,0) == '\0') &&
        (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar66[0x1f])
    break;
  }
  auVar70._0_4_ = auVar74._0_4_ ^ auVar104._0_4_;
  auVar70._4_4_ = auVar74._4_4_ ^ auVar104._4_4_;
  auVar70._8_4_ = auVar74._8_4_ ^ auVar104._8_4_;
  auVar70._12_4_ = auVar74._12_4_ ^ auVar104._12_4_;
  auVar70._16_4_ = auVar74._16_4_ ^ auVar104._16_4_;
  auVar70._20_4_ = auVar74._20_4_ ^ auVar104._20_4_;
  auVar70._24_4_ = auVar74._24_4_ ^ auVar104._24_4_;
  auVar70._28_4_ = auVar74._28_4_ ^ auVar104._28_4_;
LAB_005ba898:
  local_2b60 = vorps_avx(auVar70,local_2b60);
  auVar66 = auVar104._0_32_ & ~local_2b60;
  if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar66 >> 0x7f,0) == '\0') &&
        (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar66 >> 0xbf,0) == '\0') &&
      (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar66[0x1f]) {
LAB_005ba8d6:
    iVar51 = 3;
  }
  else {
    auVar82 = ZEXT3264(local_2640);
    auVar92._8_4_ = 0xff800000;
    auVar92._0_8_ = 0xff800000ff800000;
    auVar92._12_4_ = 0xff800000;
    auVar92._16_4_ = 0xff800000;
    auVar92._20_4_ = 0xff800000;
    auVar92._24_4_ = 0xff800000;
    auVar92._28_4_ = 0xff800000;
    local_2640 = vblendvps_avx(local_2640,auVar92,local_2b60);
    iVar51 = 0;
  }
LAB_005ba8d9:
  if (iVar51 == 3) {
    auVar66 = vandps_avx(local_2880,local_2b60);
    auVar81._8_4_ = 0xff800000;
    auVar81._0_8_ = 0xff800000ff800000;
    auVar81._12_4_ = 0xff800000;
    auVar81._16_4_ = 0xff800000;
    auVar81._20_4_ = 0xff800000;
    auVar81._24_4_ = 0xff800000;
    auVar81._28_4_ = 0xff800000;
    auVar66 = vmaskmovps_avx(auVar66,auVar81);
    *(undefined1 (*) [32])local_2ca8 = auVar66;
    return;
  }
  goto LAB_005b947f;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }